

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_x_g96.c
# Opt level: O0

void func_vxc_pol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                 xc_mgga_out_params *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *in_RCX;
  long lVar5;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar6;
  double __x;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  long *in_stack_00000008;
  double tvtau1;
  double t3179;
  double t3175;
  double t3169;
  double t3166;
  double t3160;
  double t3159;
  double t3154;
  double t3150;
  double t3145;
  double t3144;
  double t3139;
  double t3138;
  double t3137;
  double t3136;
  double t3133;
  double t3131;
  double t3130;
  double t3128;
  double t3126;
  double t3125;
  double t3122;
  double t3121;
  double tvtau0;
  double t3120;
  double t3116;
  double t3110;
  double t3107;
  double t3101;
  double t3100;
  double t3095;
  double t3091;
  double t3086;
  double t3085;
  double t3080;
  double t3079;
  double t3078;
  double t3077;
  double t3074;
  double t3072;
  double t3071;
  double t3069;
  double t3067;
  double t3066;
  double t3063;
  double t3062;
  double tvlapl1;
  double tvlapl0;
  double tvsigma2;
  double t3061;
  double t3057;
  double t3052;
  double t3048;
  double t3042;
  double t3036;
  double t3035;
  double t3030;
  double t3028;
  double t3026;
  double t3024;
  double t3023;
  double t3018;
  double t3017;
  double t3013;
  double t3010;
  double t3009;
  double t3006;
  double t3005;
  double t3002;
  double t3001;
  double t3000;
  double t2996;
  double t2993;
  double t2990;
  double t2987;
  double t2985;
  double t2983;
  double t2981;
  double t2976;
  double t2974;
  double t2970;
  double t2968;
  double t2966;
  double t2963;
  double t2962;
  double t2960;
  double t2958;
  double t2956;
  double t2954;
  double t2952;
  double t2950;
  double t2948;
  double t2946;
  double t2944;
  double t2942;
  double t2940;
  double t2938;
  double t2936;
  double t2934;
  double t2932;
  double t2930;
  double t2928;
  double t2925;
  double t2922;
  double t2919;
  double t2916;
  double t2915;
  double t2911;
  double t2902;
  double t2900;
  double t2899;
  double t2896;
  double t2893;
  double t2891;
  double t2889;
  double t2887;
  double t2885;
  double t2883;
  double t2881;
  double t2879;
  double t2877;
  double t2875;
  double t2873;
  double t2871;
  double t2869;
  double t2868;
  double t2866;
  double t2864;
  double t2862;
  double t2860;
  double t2858;
  double t2856;
  double t2854;
  double t2852;
  double t2848;
  double t2846;
  double t2845;
  double t2841;
  double t2837;
  double t2834;
  double t2822;
  double t2819;
  double t2817;
  double t2815;
  double t2813;
  double t2811;
  double t2809;
  double t2807;
  double t2804;
  double t2803;
  double t2799;
  double t2798;
  double t2796;
  double t2793;
  double t2790;
  double t2788;
  double t2787;
  double t2785;
  double t2783;
  double t2782;
  double tvsigma1;
  double tvsigma0;
  double t2779;
  double t2775;
  double t2770;
  double t2766;
  double t2760;
  double t2754;
  double t2753;
  double t2748;
  double t2746;
  double t2744;
  double t2742;
  double t2741;
  double t2736;
  double t2735;
  double t2731;
  double t2728;
  double t2727;
  double t2724;
  double t2723;
  double t2720;
  double t2719;
  double t2718;
  double t2714;
  double t2711;
  double t2708;
  double t2705;
  double t2703;
  double t2701;
  double t2699;
  double t2694;
  double t2692;
  double t2688;
  double t2686;
  double t2684;
  double t2681;
  double t2680;
  double t2678;
  double t2676;
  double t2674;
  double t2672;
  double t2670;
  double t2668;
  double t2666;
  double t2664;
  double t2662;
  double t2660;
  double t2658;
  double t2656;
  double t2654;
  double t2652;
  double t2650;
  double t2648;
  double t2646;
  double t2643;
  double t2640;
  double t2637;
  double t2634;
  double t2633;
  double t2629;
  double t2620;
  double t2618;
  double t2617;
  double t2614;
  double t2611;
  double t2609;
  double t2607;
  double t2605;
  double t2603;
  double t2601;
  double t2599;
  double t2597;
  double t2595;
  double t2593;
  double t2591;
  double t2589;
  double t2587;
  double t2586;
  double t2584;
  double t2582;
  double t2580;
  double t2578;
  double t2576;
  double t2574;
  double t2572;
  double t2570;
  double t2566;
  double t2564;
  double t2563;
  double t2559;
  double t2555;
  double t2552;
  double t2540;
  double t2537;
  double t2535;
  double t2533;
  double t2531;
  double t2529;
  double t2527;
  double t2525;
  double t2522;
  double t2521;
  double t2517;
  double t2516;
  double t2514;
  double t2511;
  double t2508;
  double t2506;
  double t2505;
  double t2503;
  double t2501;
  double t2500;
  double tvrho1;
  double t2495;
  double t2490;
  double t2487;
  double t2484;
  double t2481;
  double t2478;
  double t2467;
  double t2466;
  double t2460;
  double t2459;
  double t2454;
  double t2451;
  double t2448;
  double t2436;
  double t2435;
  double t2434;
  double t2433;
  double t2432;
  double t2430;
  double t2429;
  double t2425;
  double t2422;
  double t2410;
  double t2407;
  double t2405;
  double t2403;
  double t2401;
  double t2399;
  double t2397;
  double t2395;
  double t2392;
  double t2391;
  double t2386;
  double t2385;
  double t2381;
  double t2378;
  double t2377;
  double t2374;
  double t2371;
  double t2370;
  double t2369;
  double t2365;
  double t2362;
  double t2359;
  double t2356;
  double t2354;
  double t2352;
  double t2350;
  double t2345;
  double t2343;
  double t2339;
  double t2337;
  double t2335;
  double t2332;
  double t2331;
  double t2329;
  double t2327;
  double t2325;
  double t2323;
  double t2321;
  double t2319;
  double t2317;
  double t2315;
  double t2313;
  double t2311;
  double t2309;
  double t2307;
  double t2305;
  double t2303;
  double t2301;
  double t2299;
  double t2297;
  double t2294;
  double t2291;
  double t2290;
  double t2289;
  double t2287;
  double t2284;
  double t2283;
  double t2281;
  double t2280;
  double t2277;
  double t2276;
  double t2272;
  double t2263;
  double t2261;
  double t2260;
  double t2257;
  double t2254;
  double t2252;
  double t2250;
  double t2248;
  double t2246;
  double t2244;
  double t2242;
  double t2240;
  double t2238;
  double t2236;
  double t2234;
  double t2232;
  double t2230;
  double t2229;
  double t2227;
  double t2225;
  double t2223;
  double t2221;
  double t2219;
  double t2217;
  double t2215;
  double t2213;
  double t2209;
  double t2207;
  double t2206;
  double t2203;
  double t2202;
  double t2199;
  double t2195;
  double t2192;
  double t2180;
  double t2177;
  double t2175;
  double t2173;
  double t2171;
  double t2169;
  double t2167;
  double t2165;
  double t2162;
  double t2161;
  double t2156;
  double t2155;
  double t2152;
  double t2147;
  double t2146;
  double t2144;
  double t2142;
  double t2140;
  double t2138;
  double t2137;
  double t2136;
  double t2134;
  double t2133;
  double t2132;
  double t2128;
  double t2127;
  double t2126;
  double t2125;
  double t2122;
  double t2121;
  double t2119;
  double t2117;
  double t2116;
  double t2113;
  double t2112;
  double t2108;
  double t2107;
  double t2104;
  double t2102;
  double t2098;
  double t2097;
  double t2095;
  double t2094;
  double t2090;
  double t2087;
  double t2075;
  double t2072;
  double t2070;
  double t2068;
  double t2066;
  double t2064;
  double t2062;
  double t2060;
  double t2057;
  double t2056;
  double t2051;
  double t2048;
  double t2047;
  double t2046;
  double t2042;
  double t2039;
  double t2036;
  double t2033;
  double t2031;
  double t2029;
  double t2027;
  double t2022;
  double t2020;
  double t2016;
  double t2014;
  double t2012;
  double t2009;
  double t2008;
  double t2006;
  double t2004;
  double t2002;
  double t2000;
  double t1998;
  double t1996;
  double t1994;
  double t1992;
  double t1990;
  double t1988;
  double t1986;
  double t1984;
  double t1982;
  double t1980;
  double t1978;
  double t1976;
  double t1974;
  double t1971;
  double t1968;
  double t1967;
  double t1963;
  double t1954;
  double t1952;
  double t1951;
  double t1948;
  double t1945;
  double t1943;
  double t1941;
  double t1939;
  double t1937;
  double t1935;
  double t1933;
  double t1931;
  double t1929;
  double t1927;
  double t1925;
  double t1923;
  double t1921;
  double t1920;
  double t1918;
  double t1916;
  double t1914;
  double t1912;
  double t1910;
  double t1908;
  double t1906;
  double t1904;
  double t1900;
  double t1898;
  double t1897;
  double t1895;
  double t1891;
  double t1888;
  double t1876;
  double t1873;
  double t1871;
  double t1869;
  double t1867;
  double t1865;
  double t1863;
  double t1861;
  double t1858;
  double t1857;
  double t1852;
  double t1851;
  double t1848;
  double t1847;
  double t1843;
  double t1842;
  double t1839;
  double t1838;
  double tvrho0;
  double t1835;
  double t1831;
  double t1830;
  double t1828;
  double t1827;
  double t1823;
  double t1820;
  double t1815;
  double t1811;
  double t1810;
  double t1806;
  double t1804;
  double t1800;
  double t1796;
  double t1792;
  double t1788;
  double t1784;
  double t1780;
  double t1779;
  double t1776;
  double t1775;
  double t1772;
  double t1771;
  double t1767;
  double t1764;
  double t1763;
  double t1761;
  double t1758;
  double t1757;
  double t1756;
  double t1752;
  double t1749;
  double t1748;
  double t1744;
  double t1741;
  double t1739;
  double t1737;
  double t1735;
  double t1732;
  double t1729;
  double t1728;
  double t1727;
  double t1725;
  double t1719;
  double t1717;
  double t1714;
  double t1713;
  double t1710;
  double t1706;
  double t1702;
  double t1698;
  double t1694;
  double t1690;
  double t1686;
  double t1682;
  double t1678;
  double t1674;
  double t1670;
  double t1666;
  double t1662;
  double t1661;
  double t1658;
  double t1657;
  double t1654;
  double t1653;
  double t1650;
  double t1649;
  double t1646;
  double t1645;
  double t1644;
  double t1641;
  double t1640;
  double t1639;
  double t1636;
  double t1635;
  double t1631;
  double t1628;
  double t1621;
  double t1620;
  double t1619;
  double t1617;
  double t1616;
  double t1614;
  double t1612;
  double t1609;
  double t1608;
  double t1606;
  double t1603;
  double t1599;
  double t1595;
  double t1591;
  double t1587;
  double t1583;
  double t1579;
  double t1575;
  double t1571;
  double t1567;
  double t1563;
  double t1561;
  double t1558;
  double t1554;
  double t1550;
  double t1549;
  double t1546;
  double t1543;
  double t1540;
  double t1539;
  double t1536;
  double t1535;
  double t1532;
  double t1529;
  double t1526;
  double t1524;
  double t1523;
  double t1522;
  double t1519;
  double t1518;
  double t1516;
  double t1515;
  double t1513;
  double t1509;
  double t1506;
  double t1501;
  double t1497;
  double t1496;
  double t1492;
  double t1490;
  double t1486;
  double t1482;
  double t1478;
  double t1474;
  double t1470;
  double t1466;
  double t1465;
  double t1462;
  double t1461;
  double t1458;
  double t1457;
  double t1452;
  double t1451;
  double t1448;
  double t1446;
  double t1445;
  double t1444;
  double t1443;
  double t1442;
  double t1441;
  double t1438;
  double t1437;
  double t1436;
  double t1435;
  double t1434;
  double t1431;
  double t1427;
  double t1426;
  double t1423;
  double t1421;
  double t1420;
  double t1415;
  double t1412;
  double t1409;
  double t1406;
  double t1403;
  double t1392;
  double t1391;
  double t1385;
  double t1384;
  double t1376;
  double t1373;
  double t1361;
  double t1360;
  double t1359;
  double t1358;
  double t1357;
  double t1355;
  double t1354;
  double t1350;
  double t1347;
  double t1342;
  double t1338;
  double t1337;
  double t1333;
  double t1331;
  double t1327;
  double t1323;
  double t1319;
  double t1315;
  double t1311;
  double t1307;
  double t1306;
  double t1303;
  double t1302;
  double t1299;
  double t1298;
  double t1294;
  double t1291;
  double t1290;
  double t1288;
  double t1287;
  double t1283;
  double t1280;
  double t1279;
  double t1276;
  double t1273;
  double t1272;
  double t1271;
  double t1267;
  double t1264;
  double t1263;
  double t1259;
  double t1256;
  double t1254;
  double t1252;
  double t1250;
  double t1247;
  double t1244;
  double t1243;
  double t1242;
  double t1240;
  double t1234;
  double t1232;
  double t1229;
  double t1228;
  double t1225;
  double t1221;
  double t1217;
  double t1213;
  double t1209;
  double t1205;
  double t1201;
  double t1197;
  double t1193;
  double t1189;
  double t1185;
  double t1181;
  double t1177;
  double t1176;
  double t1173;
  double t1172;
  double t1169;
  double t1168;
  double t1165;
  double t1164;
  double t1161;
  double t1160;
  double t1159;
  double t1156;
  double t1155;
  double t1154;
  double t1151;
  double t1150;
  double t1149;
  double t1147;
  double t1144;
  double t1143;
  double t1141;
  double t1140;
  double t1137;
  double t1136;
  double t1132;
  double t1129;
  double t1122;
  double t1121;
  double t1120;
  double t1118;
  double t1117;
  double t1115;
  double t1113;
  double t1110;
  double t1109;
  double t1107;
  double t1104;
  double t1100;
  double t1096;
  double t1092;
  double t1088;
  double t1084;
  double t1080;
  double t1076;
  double t1072;
  double t1068;
  double t1064;
  double t1062;
  double t1059;
  double t1055;
  double t1051;
  double t1050;
  double t1047;
  double t1044;
  double t1041;
  double t1040;
  double t1037;
  double t1036;
  double t1033;
  double t1030;
  double t1027;
  double t1025;
  double t1024;
  double t1023;
  double t1020;
  double t1019;
  double t1017;
  double t1016;
  double t1013;
  double t1012;
  double t1009;
  double t1005;
  double t1002;
  double t997;
  double t993;
  double t992;
  double t988;
  double t986;
  double t982;
  double t978;
  double t974;
  double t970;
  double t966;
  double t962;
  double t961;
  double t958;
  double t957;
  double t954;
  double t953;
  double t948;
  double t947;
  double t944;
  double t943;
  double t942;
  double t941;
  double t940;
  double t939;
  double t935;
  double t934;
  double t932;
  double t930;
  double t928;
  double t926;
  double t925;
  double t924;
  double t922;
  double t921;
  double t920;
  double t918;
  double t917;
  double t916;
  double t913;
  double t912;
  double t910;
  double t909;
  double t906;
  double t905;
  double t904;
  double t903;
  double t900;
  double t899;
  double t897;
  double t895;
  double t894;
  double t891;
  double t890;
  double t889;
  double t886;
  double t885;
  double t884;
  double t880;
  double t879;
  double t876;
  double t875;
  double t874;
  double t873;
  double t872;
  double tzk0;
  double t871;
  double t867;
  double t864;
  double t861;
  double t851;
  double t850;
  double t847;
  double t846;
  double t844;
  double t843;
  double t833;
  double t832;
  double t829;
  double t828;
  double t824;
  double t821;
  double t818;
  double t817;
  double t815;
  double t814;
  double t812;
  double t810;
  double t809;
  double t806;
  double t805;
  double t803;
  double t800;
  double t797;
  double t794;
  double t793;
  double t791;
  double t790;
  double t788;
  double t787;
  double t784;
  double t783;
  double t782;
  double t781;
  double t780;
  double t777;
  double t775;
  double t772;
  double t771;
  double t770;
  double t769;
  double t765;
  double t762;
  double t760;
  double t758;
  double t754;
  double t752;
  double t748;
  double t746;
  double t745;
  double t743;
  double t742;
  double t740;
  double t738;
  double t737;
  double t735;
  double t734;
  double t732;
  double t731;
  double t729;
  double t726;
  double t723;
  double t720;
  double t719;
  double t717;
  double t714;
  double t711;
  double t708;
  double t705;
  double t702;
  double t699;
  double t696;
  double t695;
  double t693;
  double t692;
  double t690;
  double t689;
  double t687;
  double t686;
  double t684;
  double t683;
  double t681;
  double t680;
  double t677;
  double t676;
  double t675;
  double t674;
  double t673;
  double t670;
  double t669;
  double t668;
  double t667;
  double t666;
  double t664;
  double t663;
  double t662;
  double t660;
  double t656;
  double t653;
  double t651;
  double t647;
  double t644;
  double t643;
  double t642;
  double t640;
  double t639;
  double t637;
  double t635;
  double t632;
  double t629;
  double t626;
  double t623;
  double t620;
  double t618;
  double t615;
  double t612;
  double t609;
  double t606;
  double t604;
  double t602;
  double t599;
  double t598;
  double t596;
  double t594;
  double t592;
  double t590;
  double t589;
  double t587;
  double t585;
  double t581;
  double t579;
  double t578;
  double t576;
  double t574;
  double t573;
  double t572;
  double t571;
  double t570;
  double t569;
  double t568;
  double t567;
  double t566;
  double t564;
  double t563;
  double t562;
  double t558;
  double t555;
  double t552;
  double t551;
  double t549;
  double t548;
  double t546;
  double t544;
  double t543;
  double t540;
  double t539;
  double t537;
  double t534;
  double t531;
  double t528;
  double t527;
  double t525;
  double t524;
  double t522;
  double t521;
  double t518;
  double t517;
  double t516;
  double t515;
  double t514;
  double t513;
  double t512;
  double t509;
  double t508;
  double t507;
  double t506;
  double t505;
  double t504;
  double t503;
  double t502;
  double t501;
  double t500;
  double t496;
  double t494;
  double t493;
  double t492;
  double t490;
  double t489;
  double t488;
  double t486;
  double t485;
  double t484;
  double t483;
  double t482;
  double t481;
  double t480;
  double t479;
  double t477;
  double t476;
  double t475;
  double t474;
  double t473;
  double t471;
  double t470;
  double t469;
  double t468;
  double t467;
  double t465;
  double t464;
  double t463;
  double t462;
  double t460;
  double t459;
  double t458;
  double t454;
  double t451;
  double t448;
  double t442;
  double t437;
  double t436;
  double t433;
  double t432;
  double t430;
  double t429;
  double t419;
  double t418;
  double t415;
  double t414;
  double t410;
  double t407;
  double t404;
  double t403;
  double t401;
  double t400;
  double t398;
  double t396;
  double t395;
  double t392;
  double t391;
  double t389;
  double t386;
  double t383;
  double t380;
  double t379;
  double t377;
  double t376;
  double t374;
  double t373;
  double t370;
  double t369;
  double t368;
  double t367;
  double t366;
  double t363;
  double t361;
  double t358;
  double t357;
  double t356;
  double t355;
  double t351;
  double t348;
  double t346;
  double t344;
  double t340;
  double t338;
  double t334;
  double t332;
  double t331;
  double t329;
  double t328;
  double t326;
  double t324;
  double t323;
  double t321;
  double t320;
  double t318;
  double t317;
  double t315;
  double t312;
  double t309;
  double t306;
  double t305;
  double t303;
  double t300;
  double t297;
  double t294;
  double t291;
  double t288;
  double t285;
  double t282;
  double t281;
  double t279;
  double t278;
  double t276;
  double t275;
  double t273;
  double t272;
  double t270;
  double t269;
  double t267;
  double t266;
  double t263;
  double t262;
  double t261;
  double t260;
  double t259;
  double t256;
  double t255;
  double t254;
  double t253;
  double t252;
  double t250;
  double t249;
  double t248;
  double t247;
  double t246;
  double t244;
  double t240;
  double t237;
  double t235;
  double t231;
  double t228;
  double t227;
  double t226;
  double t224;
  double t223;
  double t221;
  double t219;
  double t216;
  double t213;
  double t210;
  double t207;
  double t204;
  double t202;
  double t199;
  double t196;
  double t193;
  double t190;
  double t188;
  double t186;
  double t183;
  double t182;
  double t180;
  double t178;
  double t176;
  double t174;
  double t173;
  double t171;
  double t169;
  double t165;
  double t163;
  double t162;
  double t160;
  double t158;
  double t157;
  double t156;
  double t155;
  double t154;
  double t153;
  double t152;
  double t151;
  double t150;
  double t148;
  double t147;
  double t146;
  double t142;
  double t139;
  double t136;
  double t135;
  double t133;
  double t132;
  double t130;
  double t128;
  double t127;
  double t126;
  double t123;
  double t122;
  double t120;
  double t117;
  double t114;
  double t111;
  double t110;
  double t108;
  double t107;
  double t105;
  double t104;
  double t101;
  double t100;
  double t99;
  double t98;
  double t97;
  double t96;
  double t95;
  double t92;
  double t91;
  double t90;
  double t89;
  double t88;
  double t87;
  double t86;
  double t85;
  double t83;
  double t81;
  double t80;
  double t79;
  double t75;
  double t73;
  double t72;
  double t71;
  double t70;
  double t69;
  double t67;
  double t65;
  double t64;
  double t63;
  double t61;
  double t60;
  double t59;
  double t58;
  double t57;
  double t56;
  double t55;
  double t54;
  double t53;
  double t52;
  double t51;
  double t50;
  double t49;
  double t48;
  double t47;
  double t45;
  double t44;
  double t43;
  double t42;
  double t41;
  double t40;
  double t39;
  double t37;
  double t36;
  double t35;
  double t34;
  double t33;
  double t31;
  double t30;
  double t29;
  double t28;
  double t27;
  double t26;
  double t24;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t18;
  double t17;
  double t16;
  double t15;
  double t12;
  double t11;
  double t8;
  double t7;
  double t6;
  double t4;
  double t3;
  double t2;
  double local_3010;
  double local_3008;
  double local_3000;
  double local_2ff8;
  double local_2ff0;
  double local_2fe8;
  double local_2fe0;
  double local_2fd8;
  double local_2fd0;
  double local_2fc8;
  double local_2fc0;
  double local_2fb8;
  double local_2fb0;
  double local_2fa8;
  double local_2fa0;
  double local_2f98;
  double local_2f90;
  double local_2f88;
  double local_2f80;
  double local_2f78;
  double local_2f70;
  double local_2f68;
  double local_2f60;
  double local_2f58;
  double local_2f50;
  double local_2f48;
  double local_2f40;
  double local_2f38;
  double local_2f30;
  double local_2f28;
  double local_2f20;
  double local_2f18;
  double local_2f10;
  double local_2f08;
  double local_2f00;
  double local_2ef8;
  double local_2ef0;
  double local_2ee8;
  double local_2ee0;
  double local_2ed8;
  double local_2ed0;
  double local_2ec8;
  double local_2ec0;
  double local_2eb8;
  double local_2eb0;
  double local_2ea8;
  double local_2ea0;
  double local_2e98;
  double local_2e90;
  double local_2e88;
  double local_2e80;
  double local_2e78;
  double local_2e70;
  double local_2e68;
  double local_2e60;
  double local_2e58;
  double local_2e50;
  double local_2e48;
  double local_2e40;
  double local_2e38;
  double local_2e30;
  double local_2e28;
  double local_2e20;
  double local_2e18;
  double local_2e10;
  double local_2e08;
  double local_2e00;
  double local_2df8;
  double local_2df0;
  double local_2de8;
  double local_2de0;
  double local_2dd8;
  double local_2dd0;
  double local_2dc8;
  double local_2dc0;
  double local_2db8;
  double local_2db0;
  double local_2da8;
  double local_2da0;
  double local_2d98;
  double local_2d90;
  double local_2d88;
  double local_2d80;
  double local_2d78;
  double local_2d70;
  double local_2d68;
  double local_2d60;
  double local_2d58;
  double local_2d50;
  double local_2d48;
  double local_2d40;
  double local_2d38;
  double local_2d30;
  double local_2d28;
  double local_2d20;
  double local_2d18;
  double local_2d10;
  double local_2d08;
  double local_2d00;
  double local_2cf8;
  double local_2cf0;
  double local_2ce8;
  double local_2ce0;
  double local_2cd8;
  double local_2cd0;
  double local_2cc8;
  double local_2cc0;
  double local_2cb8;
  double local_2cb0;
  double local_2ca8;
  double local_2ca0;
  double local_2c98;
  double local_2c90;
  double local_2c88;
  double local_2c80;
  double local_2c78;
  double local_2c70;
  double local_2c68;
  double local_2c60;
  double local_2c58;
  double local_2c50;
  double local_2c48;
  double local_2c40;
  double local_2c38;
  double local_2c30;
  double local_2c28;
  double local_2c20;
  double local_2c18;
  double local_2c10;
  double local_2c08;
  double local_2c00;
  double local_2bf8;
  double local_2bf0;
  double local_2be8;
  double local_2be0;
  double local_2bd8;
  double local_2bd0;
  double local_2bc8;
  double local_2bc0;
  double local_2bb8;
  double local_2bb0;
  double local_2ba8;
  double local_2ba0;
  double local_2b98;
  double local_2b90;
  double local_2b88;
  double local_2b80;
  double local_2b78;
  double local_2b70;
  double local_2b68;
  double local_2b60;
  double local_2b58;
  
  dVar6 = (double)(*in_RDX <= (double)in_RDI[0x30]);
  __x = *in_RDX + in_RDX[1];
  local_2e98 = 1.0 / __x;
  dVar7 = (double)(*in_RDX * 2.0 * local_2e98 <= (double)in_RDI[0x31]);
  local_2c20 = (double)in_RDI[0x31] - 1.0;
  dVar8 = (double)(in_RDX[1] * 2.0 * local_2e98 <= (double)in_RDI[0x31]);
  local_2c28 = -local_2c20;
  dVar9 = *in_RDX - in_RDX[1];
  dVar10 = dVar9 * local_2e98;
  local_2b58 = local_2c20;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_2b60 = local_2c28;
    if ((dVar8 == 0.0) && (!NAN(dVar8))) {
      local_2b60 = dVar10;
    }
    local_2b58 = local_2b60;
  }
  local_2b58 = local_2b58 + 1.0;
  dVar11 = (double)(local_2b58 <= (double)in_RDI[0x31]);
  local_2c30 = cbrt((double)in_RDI[0x31]);
  local_2c10 = local_2c30 * (double)in_RDI[0x31];
  dVar12 = cbrt(local_2b58);
  local_2b68 = local_2c10;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_2b68 = dVar12 * local_2b58;
  }
  dVar13 = cbrt(__x);
  dVar14 = local_2b68 * dVar13;
  dVar308 = *in_RDX;
  dVar15 = *in_RCX * (1.0 / dVar308);
  dVar16 = 1.0 / *in_R9;
  local_2b70 = (dVar15 * dVar16) / 8.0;
  dVar17 = (double)(local_2b70 < 1.0);
  if ((dVar17 == 0.0) && (!NAN(dVar17))) {
    local_2b70 = 1.0;
  }
  dVar18 = local_2b70 * local_2b70;
  dVar19 = dVar18 * local_2b70 * 3.0 + dVar18;
  dVar20 = dVar18 * local_2b70 + 1.0;
  dVar21 = 1.0 / (dVar20 * dVar20);
  dVar22 = dVar19 * dVar21;
  dVar23 = cbrt(9.0);
  dVar24 = cbrt(0.3183098861837907);
  dVar25 = dVar23 * dVar23 * dVar24 * dVar24;
  dVar26 = dVar25 * (double)in_RDI[4];
  dVar27 = 1.0 / dVar13;
  dVar28 = dVar27 * 1.4422495703074083;
  dVar29 = cbrt(9.869604401089358);
  dVar30 = 1.0 / (dVar29 * dVar29);
  dVar31 = dVar30 * 1.8171205928321397;
  dVar32 = *in_RDX * *in_RDX;
  dVar33 = cbrt(*in_RDX);
  dVar34 = dVar33 * dVar33;
  dVar35 = (1.0 / dVar34) / dVar32;
  dVar36 = *in_RCX * dVar35;
  dVar37 = dVar31 * dVar36;
  dVar38 = ((1.0 / dVar29) / 9.869604401089358) * 3.3019272488946267;
  dVar23 = *in_RCX;
  dVar24 = *in_RCX;
  dVar39 = (1.0 / dVar33) / (dVar32 * dVar32 * *in_RDX);
  dVar40 = dVar38 * 0.002689949046226295 * dVar23 * dVar24 * dVar39 +
           dVar37 * 0.1504548888888889 + 1.0;
  dVar41 = pow(dVar40,0.1);
  dVar42 = (double)(dVar10 + 1.0 <= (double)in_RDI[0x31]);
  dVar43 = (double)(1.0 - dVar10 <= (double)in_RDI[0x31]);
  local_2b78 = local_2c20;
  if ((dVar42 == 0.0) && (!NAN(dVar42))) {
    local_2b80 = local_2c28;
    if ((dVar43 == 0.0) && (!NAN(dVar43))) {
      local_2b80 = dVar10;
    }
    local_2b78 = local_2b80;
  }
  dVar44 = (double)(local_2b78 + 1.0 <= (double)in_RDI[0x31]);
  dVar45 = cbrt(local_2b78 + 1.0);
  local_2b88 = local_2c30;
  if ((dVar44 == 0.0) && (!NAN(dVar44))) {
    local_2b88 = dVar45;
  }
  dVar46 = 1.0 / local_2b88;
  dVar47 = (1.0 / dVar41) * dVar46;
  local_2b90 = (dVar26 * dVar28 * dVar47) / 18.0;
  dVar48 = (double)(local_2b90 < 1e-10);
  if ((dVar48 != 0.0) || (NAN(dVar48))) {
    local_2b90 = 1e-10;
  }
  dVar49 = (double)(1.35 <= local_2b90);
  dVar50 = (double)(1.35 < local_2b90);
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    local_2b98 = local_2b90;
  }
  else {
    local_2b98 = 1.35;
  }
  dVar51 = local_2b98 * local_2b98;
  dVar52 = dVar51 * dVar51;
  dVar53 = dVar52 * dVar52;
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    local_2ba0 = 1.35;
  }
  else {
    local_2ba0 = local_2b90;
  }
  dVar54 = sqrt(3.141592653589793);
  dVar55 = 1.0 / local_2ba0;
  dVar56 = erf(dVar55 / 2.0);
  dVar57 = local_2ba0 * local_2ba0;
  dVar58 = exp(-(1.0 / dVar57) / 4.0);
  dVar59 = -(dVar57 * 2.0) * (dVar58 - 1.0) + (dVar58 - 1.5);
  dVar56 = local_2ba0 * 2.0 * dVar59 + dVar54 * dVar56;
  if ((dVar49 != 0.0) || (NAN(dVar49))) {
    local_2ba8 = (((((((1.0 / dVar51) / 36.0 - (1.0 / dVar52) / 960.0) +
                     (1.0 / (dVar52 * dVar51)) / 26880.0) - (1.0 / dVar53) / 829440.0) +
                   ((1.0 / dVar53) / dVar51) / 28385280.0) -
                  ((1.0 / dVar53) / dVar52) / 1073479680.0) +
                 ((1.0 / dVar53) / (dVar52 * dVar51)) / 44590694400.0) -
                 (1.0 / (dVar53 * dVar53)) / 2021444812800.0;
  }
  else {
    local_2ba8 = -(local_2ba0 * 2.6666666666666665) * dVar56 + 1.0;
  }
  dVar60 = pow(dVar40,0.2);
  dVar61 = 1.0 / dVar60;
  dVar62 = (double)(0.27 <= local_2b90);
  dVar63 = (double)(0.27 < local_2b90);
  if ((dVar63 != 0.0) || (NAN(dVar63))) {
    local_2bb0 = local_2b90;
  }
  else {
    local_2bb0 = 0.27;
  }
  dVar64 = local_2bb0 * local_2bb0;
  dVar65 = dVar64 * dVar64;
  dVar66 = dVar65 * dVar65;
  dVar67 = dVar66 * dVar65;
  dVar68 = dVar66 * dVar66;
  dVar69 = dVar68 * dVar68;
  dVar70 = dVar65 * dVar64;
  dVar71 = dVar66 * dVar70;
  dVar72 = dVar66 * dVar64;
  if ((dVar63 != 0.0) || (NAN(dVar63))) {
    local_2bb8 = 0.27;
  }
  else {
    local_2bb8 = local_2b90;
  }
  dVar73 = local_2bb8 * local_2bb8;
  dVar74 = dVar73 * dVar73 * 64.0;
  dVar75 = dVar73 * 20.0 + -dVar74;
  dVar76 = exp((-1.0 / dVar73) / 4.0);
  dVar77 = erf((1.0 / local_2bb8) / 2.0);
  dVar74 = (dVar73 * -36.0 + dVar54 * 10.0 * local_2bb8 * dVar77 + dVar75 * dVar76 + dVar74) - 3.0;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_2bc0 = (((((((1.0 / dVar66) * 3.804788961038961e-06 +
                      (((((1.0 / dVar69) / dVar67) / 3.3929038000650147e+37 -
                        ((1.0 / dVar69) / dVar71) / 3.511556992918352e+39) +
                       0.0013392857142857143 / dVar65) - (1.0 / dVar70) / 11520.0)) -
                     (1.0 / dVar72) / 7454720.0) + (1.0 / dVar67) / 247726080.0) -
                   (1.0 / dVar71) / 9358540800.0) + (1.0 / dVar68) / 394474291200.0) -
                 (1.0 / (dVar68 * dVar64)) / 18311911833600.0) +
                 ((1.0 / dVar68) / dVar65) / 927028425523200.0 +
                 ((((((((((-((1.0 / dVar68) / dVar70) / 5.0785035485184e+16 +
                          ((1.0 / dVar68) / dVar66) / 2.991700272218112e+18) -
                         ((1.0 / dVar68) / dVar72) / 1.88514051721003e+20) +
                        ((1.0 / dVar68) / dVar67) / 1.2648942844388573e+22) -
                       ((1.0 / dVar68) / dVar71) / 9.002316741416457e+23) +
                      (1.0 / dVar69) / 6.772652029299977e+25) -
                     ((1.0 / dVar69) / dVar64) / 5.36974553751641e+27) +
                    ((1.0 / dVar69) / dVar65) / 4.474731034888079e+29) -
                   ((1.0 / dVar69) / dVar70) / 3.909716563474291e+31) +
                  ((1.0 / dVar69) / dVar66) / 3.5738523369945735e+33) -
                 ((1.0 / dVar69) / dVar72) / 3.410951160703658e+35);
  }
  else {
    local_2bc0 = dVar73 * 24.0 * dVar74 + 1.0;
  }
  dVar70 = (1.0 / dVar34) / *in_RDX;
  dVar67 = *in_R9;
  dVar71 = dVar67 * dVar70 * 0.14554132;
  dVar78 = dVar29 * dVar29 * 3.3019272488946267;
  dVar29 = dVar78 * 0.043662396;
  dVar72 = dVar36 * 0.04229627833333333 + -dVar71 + dVar29;
  dVar79 = 1.0 / (dVar60 * dVar60);
  dVar80 = dVar31 * dVar79;
  dVar81 = (double)(0.32 <= local_2b90);
  dVar82 = (double)(0.32 < local_2b90);
  if ((dVar82 != 0.0) || (NAN(dVar82))) {
    local_2bc8 = local_2b90;
  }
  else {
    local_2bc8 = 0.32;
  }
  dVar83 = local_2bc8 * local_2bc8;
  dVar84 = dVar83 * dVar83;
  dVar85 = dVar84 * dVar83;
  dVar86 = dVar84 * dVar84;
  dVar87 = dVar86 * dVar86;
  dVar88 = dVar87 * dVar87;
  local_2bd8 = ((((((((((((((((1.0 / dVar86) * 5.871587902837903e-07 +
                             (0.0003826530612244898 / dVar84 - (1.0 / dVar85) / 56448.0)) -
                            (1.0 / (dVar86 * dVar83)) / 61501440.0) +
                           (1.0 / (dVar86 * dVar84)) / 2530344960.0) -
                          (1.0 / (dVar86 * dVar85)) / 115811942400.0) +
                         (1.0 / dVar87) / 5811921223680.0) -
                        ((1.0 / dVar87) / dVar83) / 316612955602944.0) +
                       ((1.0 / dVar87) / dVar84) / 1.85827061661696e+16) -
                      ((1.0 / dVar87) / dVar85) / 1.168055816159232e+18) +
                     ((1.0 / dVar87) / dVar86) / 7.824446865801216e+19) -
                    ((1.0 / dVar87) / (dVar86 * dVar83)) / 5.562511054710453e+21) +
                   ((1.0 / dVar87) / (dVar86 * dVar84)) / 4.181740504354862e+23) -
                  ((1.0 / dVar87) / (dVar86 * dVar85)) / 3.3139778504339334e+25) +
                 (1.0 / dVar88) / 2.7608516801793436e+27) -
                ((1.0 / dVar88) / dVar83) / 2.4119107039344544e+29) +
               ((1.0 / dVar88) / dVar84) / 2.2046293272414373e+31) -
               ((1.0 / dVar88) / dVar85) / 2.1042094544618633e+33;
  if ((dVar82 != 0.0) || (NAN(dVar82))) {
    local_2bd0 = 0.32;
  }
  else {
    local_2bd0 = local_2b90;
  }
  dVar85 = local_2bd0 * local_2bd0;
  dVar89 = dVar85 * local_2bd0;
  dVar90 = dVar85 * dVar85;
  dVar91 = dVar90 * local_2bd0;
  dVar92 = dVar90 * dVar90;
  dVar93 = dVar92 * local_2bd0 * -122880.0 +
           dVar90 * dVar89 * 3840.0 + dVar91 * -576.0 + local_2bd0 * -8.0 + dVar89 * 256.0;
  dVar94 = 1.0 / dVar85;
  dVar95 = exp(-dVar94 / 4.0);
  dVar96 = dVar90 * dVar85;
  dVar97 = dVar96 * 5120.0 + dVar90 * -1440.0 + dVar85 * 224.0 + -35.0;
  dVar98 = dVar85 * 60.0 + -2.0;
  dVar99 = erf((1.0 / local_2bd0) / 2.0);
  dVar100 = dVar93 * dVar95 + dVar54 * 2.0 * dVar98 * dVar99 + dVar89 * 24.0 * dVar97;
  if ((dVar81 == 0.0) && (!NAN(dVar81))) {
    local_2bd8 = local_2bd0 * 1.1428571428571428 * dVar100 + 1.0;
  }
  dVar101 = local_2bd8 * 1.8171205928321397 * dVar30;
  dVar102 = dVar36 * dVar79;
  dVar103 = dVar101 * 0.026329605555555555 * dVar102 +
            local_2ba8 * dVar61 + local_2bc0 * dVar72 * 0.43209876543209874 * dVar80;
  dVar104 = 1.0 - dVar22;
  local_2be8 = (dVar26 * dVar28 * dVar46) / 18.0;
  dVar105 = (double)(1.35 <= local_2be8);
  dVar106 = (double)(1.35 < local_2be8);
  local_2be0 = local_2be8;
  if ((dVar106 == 0.0) && (!NAN(dVar106))) {
    local_2be0 = 1.35;
  }
  dVar107 = local_2be0 * local_2be0;
  dVar108 = dVar107 * dVar107;
  dVar109 = dVar108 * dVar108;
  if ((dVar106 != 0.0) || (NAN(dVar106))) {
    local_2be8 = 1.35;
  }
  dVar110 = 1.0 / local_2be8;
  dVar111 = erf(dVar110 / 2.0);
  dVar112 = local_2be8 * local_2be8;
  dVar113 = exp(-(1.0 / dVar112) / 4.0);
  dVar114 = -(dVar112 * 2.0) * (dVar113 - 1.0) + (dVar113 - 1.5);
  dVar111 = dVar54 * dVar111 + local_2be8 * 2.0 * dVar114;
  if ((dVar105 != 0.0) || (NAN(dVar105))) {
    local_2bf0 = (((((((1.0 / dVar107) / 36.0 - (1.0 / dVar108) / 960.0) +
                     (1.0 / (dVar108 * dVar107)) / 26880.0) - (1.0 / dVar109) / 829440.0) +
                   ((1.0 / dVar109) / dVar107) / 28385280.0) -
                  ((1.0 / dVar109) / dVar108) / 1073479680.0) +
                 ((1.0 / dVar109) / (dVar108 * dVar107)) / 44590694400.0) -
                 (1.0 / (dVar109 * dVar109)) / 2021444812800.0;
  }
  else {
    local_2bf0 = -(local_2be8 * 2.6666666666666665) * dVar111 + 1.0;
  }
  dVar115 = dVar104 * local_2bf0;
  dVar116 = (dVar37 * 0.0028577960676726107 + 0.12345679012345678) * 1.8171205928321397;
  dVar270 = *in_RCX;
  dVar67 = (((dVar67 * dVar70 - dVar36 / 8.0) * 1.8171205928321397 * dVar30) / 4.0 - 0.45) +
           dVar37 / 36.0;
  dVar117 = dVar67 * local_2b70;
  dVar118 = 1.0 - local_2b70;
  dVar119 = pow(-(dVar117 * 1.0814814814814815) * dVar118 +
                dVar67 * dVar67 * 0.7209876543209877 +
                dVar116 * 0.4166666666666667 * dVar30 * dVar270 * dVar35 + 1.0,0.1);
  dVar78 = dVar78 * 0.256337604;
  dVar120 = -((dVar36 * 0.011867481666666667 + dVar71 + dVar78) * 0.5555555555555556 *
             1.8171205928321397) * dVar30 + dVar37 * 0.06394332777777778 + 1.0;
  dVar37 = dVar120 * 0.7777777777777778 * dVar79 + dVar61;
  dVar71 = dVar104 * dVar119 +
           -(double)in_RDI[6] * (dVar103 * dVar22 + dVar115 * dVar119) + dVar22 * dVar37;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2bf8 = 0.0;
  }
  else {
    local_2bf8 = dVar14 * -0.36927938319101117 * dVar71;
  }
  dVar121 = (double)(in_RDX[1] <= (double)in_RDI[0x30]);
  local_2c00 = local_2c20;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_2c08 = local_2c28;
    if ((dVar7 == 0.0) && (!NAN(dVar7))) {
      local_2c08 = -dVar9 * local_2e98;
    }
    local_2c00 = local_2c08;
  }
  local_2c00 = local_2c00 + 1.0;
  dVar122 = (double)(local_2c00 <= (double)in_RDI[0x31]);
  dVar123 = cbrt(local_2c00);
  if ((dVar122 == 0.0) && (!NAN(dVar122))) {
    local_2c10 = dVar123 * local_2c00;
  }
  dVar124 = local_2c10 * dVar13;
  dVar1 = in_RDX[1];
  dVar125 = in_RCX[2] * (1.0 / dVar1);
  dVar126 = 1.0 / in_R9[1];
  local_2c18 = (dVar125 * dVar126) / 8.0;
  dVar127 = (double)(local_2c18 < 1.0);
  if ((dVar127 == 0.0) && (!NAN(dVar127))) {
    local_2c18 = 1.0;
  }
  dVar128 = local_2c18 * local_2c18;
  dVar129 = dVar128 * local_2c18 * 3.0 + dVar128;
  dVar130 = dVar128 * local_2c18 + 1.0;
  dVar131 = 1.0 / (dVar130 * dVar130);
  dVar132 = dVar129 * dVar131;
  dVar133 = in_RDX[1] * in_RDX[1];
  dVar134 = cbrt(in_RDX[1]);
  dVar135 = dVar134 * dVar134;
  dVar136 = (1.0 / dVar135) / dVar133;
  dVar137 = in_RCX[2] * dVar136;
  dVar138 = dVar31 * dVar137;
  dVar2 = in_RCX[2];
  dVar3 = in_RCX[2];
  dVar139 = (1.0 / dVar134) / (dVar133 * dVar133 * in_RDX[1]);
  dVar140 = dVar38 * 0.002689949046226295 * dVar2 * dVar3 * dVar139 +
            dVar138 * 0.1504548888888889 + 1.0;
  dVar141 = pow(dVar140,0.1);
  if ((dVar43 == 0.0) && (!NAN(dVar43))) {
    if ((dVar42 == 0.0) && (!NAN(dVar42))) {
      local_2c28 = -dVar10;
    }
    local_2c20 = local_2c28;
  }
  dVar10 = (double)(local_2c20 + 1.0 <= (double)in_RDI[0x31]);
  dVar142 = cbrt(local_2c20 + 1.0);
  if ((dVar10 == 0.0) && (!NAN(dVar10))) {
    local_2c30 = dVar142;
  }
  dVar143 = 1.0 / local_2c30;
  dVar144 = (1.0 / dVar141) * dVar143;
  local_2c38 = (dVar26 * dVar28 * dVar144) / 18.0;
  dVar145 = (double)(local_2c38 < 1e-10);
  if ((dVar145 != 0.0) || (NAN(dVar145))) {
    local_2c38 = 1e-10;
  }
  dVar146 = (double)(1.35 <= local_2c38);
  dVar147 = (double)(1.35 < local_2c38);
  if ((dVar147 != 0.0) || (NAN(dVar147))) {
    local_2c40 = local_2c38;
  }
  else {
    local_2c40 = 1.35;
  }
  dVar148 = local_2c40 * local_2c40;
  dVar149 = dVar148 * dVar148;
  dVar150 = dVar149 * dVar149;
  if ((dVar147 != 0.0) || (NAN(dVar147))) {
    local_2c48 = 1.35;
  }
  else {
    local_2c48 = local_2c38;
  }
  dVar151 = 1.0 / local_2c48;
  dVar152 = erf(dVar151 / 2.0);
  dVar153 = local_2c48 * local_2c48;
  dVar154 = exp(-(1.0 / dVar153) / 4.0);
  dVar155 = -(dVar153 * 2.0) * (dVar154 - 1.0) + (dVar154 - 1.5);
  dVar152 = dVar54 * dVar152 + local_2c48 * 2.0 * dVar155;
  if ((dVar146 != 0.0) || (NAN(dVar146))) {
    local_2c50 = (((((((1.0 / dVar148) / 36.0 - (1.0 / dVar149) / 960.0) +
                     (1.0 / (dVar149 * dVar148)) / 26880.0) - (1.0 / dVar150) / 829440.0) +
                   ((1.0 / dVar150) / dVar148) / 28385280.0) -
                  ((1.0 / dVar150) / dVar149) / 1073479680.0) +
                 ((1.0 / dVar150) / (dVar149 * dVar148)) / 44590694400.0) -
                 (1.0 / (dVar150 * dVar150)) / 2021444812800.0;
  }
  else {
    local_2c50 = -(local_2c48 * 2.6666666666666665) * dVar152 + 1.0;
  }
  dVar156 = pow(dVar140,0.2);
  dVar157 = 1.0 / dVar156;
  dVar158 = (double)(0.27 <= local_2c38);
  dVar159 = (double)(0.27 < local_2c38);
  if ((dVar159 != 0.0) || (NAN(dVar159))) {
    local_2c58 = local_2c38;
  }
  else {
    local_2c58 = 0.27;
  }
  dVar160 = local_2c58 * local_2c58;
  dVar161 = dVar160 * dVar160;
  dVar162 = dVar161 * dVar161;
  dVar163 = dVar162 * dVar161;
  dVar164 = dVar162 * dVar162;
  dVar165 = dVar164 * dVar164;
  dVar166 = dVar161 * dVar160;
  dVar167 = dVar162 * dVar166;
  dVar168 = dVar162 * dVar160;
  if ((dVar159 != 0.0) || (NAN(dVar159))) {
    local_2c60 = 0.27;
  }
  else {
    local_2c60 = local_2c38;
  }
  dVar169 = local_2c60 * local_2c60;
  dVar170 = dVar169 * dVar169 * 64.0;
  dVar171 = dVar169 * 20.0 + -dVar170;
  dVar172 = exp((-1.0 / dVar169) / 4.0);
  dVar173 = erf((1.0 / local_2c60) / 2.0);
  dVar170 = (dVar169 * -36.0 + dVar54 * 10.0 * local_2c60 * dVar173 + dVar171 * dVar172 + dVar170) -
            3.0;
  if ((dVar158 != 0.0) || (NAN(dVar158))) {
    local_2c68 = (((((((1.0 / dVar162) * 3.804788961038961e-06 +
                      (((((1.0 / dVar165) / dVar163) / 3.3929038000650147e+37 -
                        ((1.0 / dVar165) / dVar167) / 3.511556992918352e+39) +
                       0.0013392857142857143 / dVar161) - (1.0 / dVar166) / 11520.0)) -
                     (1.0 / dVar168) / 7454720.0) + (1.0 / dVar163) / 247726080.0) -
                   (1.0 / dVar167) / 9358540800.0) + (1.0 / dVar164) / 394474291200.0) -
                 (1.0 / (dVar164 * dVar160)) / 18311911833600.0) +
                 ((1.0 / dVar164) / dVar161) / 927028425523200.0 +
                 ((((((((((-((1.0 / dVar164) / dVar166) / 5.0785035485184e+16 +
                          ((1.0 / dVar164) / dVar162) / 2.991700272218112e+18) -
                         ((1.0 / dVar164) / dVar168) / 1.88514051721003e+20) +
                        ((1.0 / dVar164) / dVar163) / 1.2648942844388573e+22) -
                       ((1.0 / dVar164) / dVar167) / 9.002316741416457e+23) +
                      (1.0 / dVar165) / 6.772652029299977e+25) -
                     ((1.0 / dVar165) / dVar160) / 5.36974553751641e+27) +
                    ((1.0 / dVar165) / dVar161) / 4.474731034888079e+29) -
                   ((1.0 / dVar165) / dVar166) / 3.909716563474291e+31) +
                  ((1.0 / dVar165) / dVar162) / 3.5738523369945735e+33) -
                 ((1.0 / dVar165) / dVar168) / 3.410951160703658e+35);
  }
  else {
    local_2c68 = dVar169 * 24.0 * dVar170 + 1.0;
  }
  dVar166 = (1.0 / dVar135) / in_RDX[1];
  dVar163 = in_R9[1];
  dVar167 = dVar163 * dVar166 * 0.14554132;
  dVar29 = dVar137 * 0.04229627833333333 + -dVar167 + dVar29;
  dVar168 = 1.0 / (dVar156 * dVar156);
  dVar174 = dVar31 * dVar168;
  dVar175 = (double)(0.32 <= local_2c38);
  dVar176 = (double)(0.32 < local_2c38);
  if ((dVar176 != 0.0) || (NAN(dVar176))) {
    local_2c70 = local_2c38;
  }
  else {
    local_2c70 = 0.32;
  }
  dVar177 = local_2c70 * local_2c70;
  dVar178 = dVar177 * dVar177;
  dVar179 = dVar178 * dVar177;
  dVar180 = dVar178 * dVar178;
  dVar181 = dVar180 * dVar180;
  dVar182 = dVar181 * dVar181;
  local_2c80 = ((((((((((((((((1.0 / dVar180) * 5.871587902837903e-07 +
                             (0.0003826530612244898 / dVar178 - (1.0 / dVar179) / 56448.0)) -
                            (1.0 / (dVar180 * dVar177)) / 61501440.0) +
                           (1.0 / (dVar180 * dVar178)) / 2530344960.0) -
                          (1.0 / (dVar180 * dVar179)) / 115811942400.0) +
                         (1.0 / dVar181) / 5811921223680.0) -
                        ((1.0 / dVar181) / dVar177) / 316612955602944.0) +
                       ((1.0 / dVar181) / dVar178) / 1.85827061661696e+16) -
                      ((1.0 / dVar181) / dVar179) / 1.168055816159232e+18) +
                     ((1.0 / dVar181) / dVar180) / 7.824446865801216e+19) -
                    ((1.0 / dVar181) / (dVar180 * dVar177)) / 5.562511054710453e+21) +
                   ((1.0 / dVar181) / (dVar180 * dVar178)) / 4.181740504354862e+23) -
                  ((1.0 / dVar181) / (dVar180 * dVar179)) / 3.3139778504339334e+25) +
                 (1.0 / dVar182) / 2.7608516801793436e+27) -
                ((1.0 / dVar182) / dVar177) / 2.4119107039344544e+29) +
               ((1.0 / dVar182) / dVar178) / 2.2046293272414373e+31) -
               ((1.0 / dVar182) / dVar179) / 2.1042094544618633e+33;
  if ((dVar176 != 0.0) || (NAN(dVar176))) {
    local_2c78 = 0.32;
  }
  else {
    local_2c78 = local_2c38;
  }
  dVar179 = local_2c78 * local_2c78;
  dVar183 = dVar179 * local_2c78;
  dVar184 = dVar179 * dVar179;
  dVar185 = dVar184 * local_2c78;
  dVar186 = dVar184 * dVar184;
  dVar187 = dVar186 * local_2c78 * -122880.0 +
            dVar184 * dVar183 * 3840.0 + dVar185 * -576.0 + local_2c78 * -8.0 + dVar183 * 256.0;
  dVar188 = 1.0 / dVar179;
  dVar189 = exp(-dVar188 / 4.0);
  dVar190 = dVar184 * dVar179;
  dVar191 = dVar190 * 5120.0 + dVar184 * -1440.0 + dVar179 * 224.0 + -35.0;
  dVar192 = dVar179 * 60.0 + -2.0;
  dVar193 = erf((1.0 / local_2c78) / 2.0);
  dVar194 = dVar187 * dVar189 + dVar54 * 2.0 * dVar192 * dVar193 + dVar183 * 24.0 * dVar191;
  if ((dVar175 == 0.0) && (!NAN(dVar175))) {
    local_2c80 = local_2c78 * 1.1428571428571428 * dVar194 + 1.0;
  }
  dVar195 = local_2c80 * 1.8171205928321397 * dVar30;
  dVar196 = dVar137 * dVar168;
  dVar197 = dVar195 * 0.026329605555555555 * dVar196 +
            local_2c50 * dVar157 + local_2c68 * dVar29 * 0.43209876543209874 * dVar174;
  dVar198 = 1.0 - dVar132;
  local_2c90 = (dVar26 * dVar28 * dVar143) / 18.0;
  dVar199 = (double)(1.35 <= local_2c90);
  dVar200 = (double)(1.35 < local_2c90);
  local_2c88 = local_2c90;
  if ((dVar200 == 0.0) && (!NAN(dVar200))) {
    local_2c88 = 1.35;
  }
  dVar201 = local_2c88 * local_2c88;
  dVar202 = dVar201 * dVar201;
  dVar203 = dVar202 * dVar202;
  if ((dVar200 != 0.0) || (NAN(dVar200))) {
    local_2c90 = 1.35;
  }
  dVar204 = 1.0 / local_2c90;
  dVar205 = erf(dVar204 / 2.0);
  dVar206 = local_2c90 * local_2c90;
  dVar207 = exp(-(1.0 / dVar206) / 4.0);
  dVar208 = -(dVar206 * 2.0) * (dVar207 - 1.0) + (dVar207 - 1.5);
  dVar205 = dVar54 * dVar205 + local_2c90 * 2.0 * dVar208;
  if ((dVar199 != 0.0) || (NAN(dVar199))) {
    local_2c98 = (((((((1.0 / dVar201) / 36.0 - (1.0 / dVar202) / 960.0) +
                     (1.0 / (dVar202 * dVar201)) / 26880.0) - (1.0 / dVar203) / 829440.0) +
                   ((1.0 / dVar203) / dVar201) / 28385280.0) -
                  ((1.0 / dVar203) / dVar202) / 1073479680.0) +
                 ((1.0 / dVar203) / (dVar202 * dVar201)) / 44590694400.0) -
                 (1.0 / (dVar203 * dVar203)) / 2021444812800.0;
  }
  else {
    local_2c98 = -(local_2c90 * 2.6666666666666665) * dVar205 + 1.0;
  }
  dVar209 = dVar198 * local_2c98;
  dVar210 = (dVar138 * 0.0028577960676726107 + 0.12345679012345678) * 1.8171205928321397;
  dVar4 = in_RCX[2];
  dVar163 = (((dVar163 * dVar166 - dVar137 / 8.0) * 1.8171205928321397 * dVar30) / 4.0 - 0.45) +
            dVar138 / 36.0;
  dVar211 = dVar163 * local_2c18;
  dVar212 = 1.0 - local_2c18;
  dVar213 = pow(-(dVar211 * 1.0814814814814815) * dVar212 +
                dVar163 * dVar163 * 0.7209876543209877 +
                dVar210 * 0.4166666666666667 * dVar30 * dVar4 * dVar136 + 1.0,0.1);
  dVar167 = -((dVar137 * 0.011867481666666667 + dVar167 + dVar78) * 0.5555555555555556 *
             1.8171205928321397) * dVar30 + dVar138 * 0.06394332777777778 + 1.0;
  dVar78 = dVar167 * 0.7777777777777778 * dVar168 + dVar157;
  dVar138 = dVar198 * dVar213 +
            -(double)in_RDI[6] * (dVar132 * dVar197 + dVar209 * dVar213) + dVar132 * dVar78;
  if ((dVar121 != 0.0) || (NAN(dVar121))) {
    local_2ca0 = 0.0;
  }
  else {
    local_2ca0 = dVar124 * -0.36927938319101117 * dVar138;
  }
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar5 * 8) =
         local_2bf8 + local_2ca0 + *(double *)(*in_stack_00000008 + lVar5 * 8);
  }
  dVar214 = 1.0 / (__x * __x);
  local_2eb8 = dVar9 * dVar214;
  local_2d70 = local_2e98 - local_2eb8;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    local_2ca8 = 0.0;
  }
  else {
    if ((dVar8 != 0.0) || (local_2cb0 = local_2d70, NAN(dVar8))) {
      local_2cb0 = 0.0;
    }
    local_2ca8 = local_2cb0;
  }
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_2cb8 = 0.0;
  }
  else {
    local_2cb8 = dVar12 * 1.3333333333333333 * local_2ca8;
  }
  dVar215 = 1.0 / (dVar13 * dVar13);
  dVar216 = (local_2b68 * dVar215 * 0.9847450218426964 * dVar71) / 8.0;
  if ((dVar17 != 0.0) || (NAN(dVar17))) {
    local_2cc0 = (-(*in_RCX * (1.0 / dVar32)) * dVar16) / 8.0;
  }
  else {
    local_2cc0 = 0.0;
  }
  dVar217 = (local_2b70 * local_2cc0 + local_2b70 * local_2cc0 + dVar18 * local_2cc0 * 9.0) * dVar21
  ;
  dVar19 = dVar19 * ((1.0 / (dVar20 * dVar20)) / dVar20);
  dVar20 = dVar103 * dVar18;
  dVar51 = dVar51 * local_2b98;
  dVar218 = 1.0 / dVar51;
  dVar219 = ((1.0 / dVar13) / __x) * 1.4422495703074083;
  dVar47 = (dVar26 * dVar219 * dVar47) / 54.0;
  dVar25 = dVar25 * (double)in_RDI[4] * 1.4422495703074083;
  dVar220 = dVar27 * ((1.0 / dVar41) / dVar40);
  dVar34 = (1.0 / dVar34) / (dVar32 * *in_RDX);
  dVar221 = *in_RCX * dVar34;
  dVar222 = dVar31 * dVar221;
  dVar23 = dVar38 * dVar23 * dVar24 * ((1.0 / dVar33) / (dVar32 * dVar32 * dVar32));
  dVar24 = dVar222 * -0.40121303703703703 + -(dVar23 * 0.014346394913206906);
  dVar32 = dVar27 * (1.0 / dVar41);
  dVar41 = 1.0 / (local_2b88 * local_2b88);
  dVar33 = 1.0 / (dVar45 * dVar45);
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2cc8 = 0.0;
  }
  else {
    if ((dVar43 != 0.0) || (local_2cd0 = local_2d70, NAN(dVar43))) {
      local_2cd0 = 0.0;
    }
    local_2cc8 = local_2cd0;
  }
  if ((dVar44 != 0.0) || (NAN(dVar44))) {
    local_2cd8 = 0.0;
  }
  else {
    local_2cd8 = (dVar33 * local_2cc8) / 3.0;
  }
  local_2cd8 = dVar41 * local_2cd8;
  if ((dVar48 != 0.0) || (NAN(dVar48))) {
    local_2ce0 = 0.0;
  }
  else {
    local_2ce0 = (-dVar47 - (dVar25 * dVar220 * dVar46 * dVar24) / 180.0) -
                 (dVar25 * dVar32 * local_2cd8) / 18.0;
  }
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    local_2ce8 = local_2ce0;
  }
  else {
    local_2ce8 = 0.0;
  }
  dVar45 = 1.0 / (dVar52 * local_2b98);
  dVar223 = 1.0 / (dVar52 * dVar51);
  dVar224 = (1.0 / dVar53) / local_2b98;
  dVar225 = (1.0 / dVar53) / dVar51;
  dVar226 = (1.0 / dVar53) / (dVar52 * local_2b98);
  dVar52 = (1.0 / dVar53) / (dVar52 * dVar51);
  local_2b98 = (1.0 / (dVar53 * dVar53)) / local_2b98;
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    local_2cf0 = 0.0;
  }
  else {
    local_2cf0 = local_2ce0;
  }
  dVar53 = dVar58 * (1.0 / dVar57);
  dVar51 = 1.0 / (dVar57 * local_2ba0);
  dVar57 = local_2ba0 * (dVar58 - 1.0);
  if ((dVar49 != 0.0) || (NAN(dVar49))) {
    local_2cf8 = (((((((-dVar218 * local_2ce8) / 18.0 + (dVar45 * local_2ce8) / 240.0) -
                     (dVar223 * local_2ce8) / 4480.0) + (dVar224 * local_2ce8) / 103680.0) -
                   (dVar225 * local_2ce8) / 2838528.0) + (dVar226 * local_2ce8) / 89456640.0) -
                 (dVar52 * local_2ce8) / 3185049600.0) + (local_2b98 * local_2ce8) / 126340300800.0;
  }
  else {
    local_2cf8 = local_2ba0 * -2.6666666666666665 *
                 (-local_2cf0 * dVar53 +
                 (-(dVar55 * local_2cf0) * dVar58 +
                 -(dVar57 * 4.0) * local_2cf0 + (dVar51 * local_2cf0 * dVar58) / 2.0) * 2.0 *
                 local_2ba0 + dVar59 * 2.0 * local_2cf0) +
                 -(local_2cf0 * 2.6666666666666665 * dVar56);
  }
  dVar227 = (1.0 / dVar60) / dVar40;
  dVar228 = dVar65 * local_2bb0;
  dVar229 = dVar66 * dVar228;
  dVar230 = (1.0 / dVar69) / dVar229;
  if ((dVar63 != 0.0) || (NAN(dVar63))) {
    local_2d00 = local_2ce0;
  }
  else {
    local_2d00 = 0.0;
  }
  dVar64 = dVar64 * local_2bb0;
  dVar65 = dVar65 * dVar64;
  dVar231 = dVar66 * dVar65;
  dVar232 = (1.0 / dVar69) / dVar231;
  dVar233 = 1.0 / dVar228;
  dVar234 = 1.0 / dVar65;
  dVar235 = dVar66 * local_2bb0;
  dVar236 = 1.0 / dVar235;
  dVar66 = dVar66 * dVar64;
  dVar237 = 1.0 / dVar66;
  dVar238 = 1.0 / dVar229;
  dVar239 = 1.0 / dVar231;
  dVar240 = 1.0 / (dVar68 * local_2bb0);
  dVar241 = (1.0 / dVar68) / dVar64;
  dVar242 = (1.0 / dVar68) / dVar228;
  dVar243 = (1.0 / dVar68) / dVar65;
  dVar244 = (1.0 / dVar68) / dVar235;
  dVar245 = (1.0 / dVar68) / dVar66;
  dVar229 = (1.0 / dVar68) / dVar229;
  dVar231 = (1.0 / dVar68) / dVar231;
  local_2bb0 = (1.0 / dVar69) / local_2bb0;
  dVar64 = (1.0 / dVar69) / dVar64;
  dVar228 = (1.0 / dVar69) / dVar228;
  dVar65 = (1.0 / dVar69) / dVar65;
  dVar235 = (1.0 / dVar69) / dVar235;
  dVar66 = (1.0 / dVar69) / dVar66;
  dVar74 = local_2bb8 * dVar74;
  if ((dVar63 != 0.0) || (NAN(dVar63))) {
    local_2d08 = 0.0;
  }
  else {
    local_2d08 = local_2ce0;
  }
  dVar68 = dVar73 * local_2bb8;
  dVar69 = dVar68 * 256.0 * local_2d08;
  dVar75 = dVar75 * (1.0 / dVar68);
  dVar246 = (1.0 / local_2bb8) * dVar76;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_2d10 = ((((((-(dVar236 * 3.0438311688311688e-05) * local_2d00 +
                       -(dVar233 * 0.005357142857142857) * local_2d00 +
                       (-dVar230 * local_2d00) / 7.71114500014776e+35 +
                       (dVar232 * local_2d00) / 7.633819549822504e+37 +
                       (dVar234 * local_2d00) / 1920.0 + (dVar237 * local_2d00) / 745472.0) -
                     (dVar238 * local_2d00) / 20643840.0) + (dVar239 * local_2d00) / 668467200.0) -
                   (dVar240 * local_2d00) / 24654643200.0) +
                  (dVar241 * local_2d00) / 1017328435200.0) -
                 (dVar242 * local_2d00) / 46351421276160.0) +
                 ((((((((((dVar243 * local_2d00) / 2.308410703872e+15 -
                         (dVar244 * local_2d00) / 1.24654178009088e+17) +
                        (dVar245 * local_2d00) / 7.250540450807808e+18) -
                       (dVar229 * local_2d00) / 4.517479587281633e+20) +
                      (dVar231 * local_2d00) / 3.000772247138819e+22) -
                     (local_2bb0 * local_2d00) / 2.116453759156243e+24) +
                    (dVar64 * local_2d00) / 1.5793369227989443e+26) -
                   (dVar228 * local_2d00) / 1.2429808430244664e+28) +
                  (dVar65 * local_2d00) / 1.0288727798616555e+30) -
                 (dVar235 * local_2d00) / 8.934630842486435e+31) +
                 (dVar66 * local_2d00) / 8.121312287389663e+33;
  }
  else {
    local_2d10 = dVar74 * 48.0 * local_2d08 +
                 (-(dVar246 * 10.0) * local_2d08 +
                 local_2d08 * 10.0 * dVar54 * dVar77 +
                 local_2bb8 * local_2d08 * -72.0 +
                 (local_2bb8 * local_2d08 * 40.0 + -dVar69) * dVar76 +
                 (dVar75 * local_2d08 * dVar76) / 2.0 + dVar69) * 24.0 * dVar73;
  }
  dVar69 = *in_R9 * dVar35 * 0.24256886666666666;
  dVar247 = local_2bc0 * dVar72 * 1.8171205928321397;
  dVar40 = (1.0 / (dVar60 * dVar60)) / dVar40;
  dVar248 = dVar84 * local_2bc8;
  dVar60 = 1.0 / dVar248;
  if ((dVar82 != 0.0) || (NAN(dVar82))) {
    local_2d18 = local_2ce0;
  }
  else {
    local_2d18 = 0.0;
  }
  dVar83 = dVar83 * local_2bc8;
  dVar84 = dVar84 * dVar83;
  dVar249 = 1.0 / dVar84;
  dVar250 = 1.0 / (dVar86 * local_2bc8);
  dVar251 = 1.0 / (dVar86 * dVar83);
  dVar252 = 1.0 / (dVar86 * dVar248);
  dVar253 = 1.0 / (dVar86 * dVar84);
  dVar254 = (1.0 / dVar87) / local_2bc8;
  dVar255 = (1.0 / dVar87) / dVar83;
  dVar256 = (1.0 / dVar87) / dVar248;
  dVar257 = (1.0 / dVar87) / dVar84;
  dVar258 = (1.0 / dVar87) / (dVar86 * local_2bc8);
  dVar259 = (1.0 / dVar87) / (dVar86 * dVar83);
  dVar260 = (1.0 / dVar87) / (dVar86 * dVar248);
  dVar86 = (1.0 / dVar87) / (dVar86 * dVar84);
  local_2bc8 = (1.0 / dVar88) / local_2bc8;
  dVar83 = (1.0 / dVar88) / dVar83;
  dVar248 = (1.0 / dVar88) / dVar248;
  dVar84 = (1.0 / dVar88) / dVar84;
  local_2d28 = ((((((((((((((-(dVar250 * 4.6972703222703225e-06) * local_2d18 +
                             dVar60 * -0.001530612244897959 * local_2d18 +
                             (dVar249 * local_2d18) / 9408.0 + (dVar251 * local_2d18) / 6150144.0) -
                           (dVar252 * local_2d18) / 210862080.0) +
                          (dVar253 * local_2d18) / 8272281600.0) -
                         (dVar254 * local_2d18) / 363245076480.0) +
                        (dVar255 * local_2d18) / 17589608644608.0) -
                       (dVar256 * local_2d18) / 929135308308480.0) +
                      (dVar257 * local_2d18) / 5.3093446189056e+16) -
                     (dVar258 * local_2d18) / 3.26018619408384e+18) +
                    (dVar259 * local_2d18) / 2.1394273287347896e+20) -
                   (dVar260 * local_2d18) / 1.493478751555308e+22) +
                  (dVar86 * local_2d18) / 1.1046592834779778e+24) -
                 (local_2bc8 * local_2d18) / 8.627661500560449e+25) +
                (dVar83 * local_2d18) / 7.093855011571925e+27) -
               (dVar248 * local_2d18) / 6.123970353448437e+29) +
               (dVar84 * local_2d18) / 5.53739330121543e+31;
  if ((dVar82 != 0.0) || (NAN(dVar82))) {
    local_2d20 = 0.0;
  }
  else {
    local_2d20 = local_2ce0;
  }
  dVar93 = dVar93 * (1.0 / dVar89);
  dVar97 = dVar85 * dVar97;
  dVar87 = dVar54 * local_2bd0;
  dVar98 = dVar98 * dVar95;
  if ((dVar81 == 0.0) && (!NAN(dVar81))) {
    local_2d28 = local_2d20 * 1.1428571428571428 * dVar100 +
                 local_2bd0 * 1.1428571428571428 *
                 (-(dVar98 * 2.0) * dVar94 * local_2d20 +
                 dVar87 * 240.0 * local_2d20 * dVar99 +
                 dVar89 * 24.0 *
                 (dVar91 * local_2d20 * 30720.0 +
                 local_2bd0 * local_2d20 * 448.0 + -(dVar89 * local_2d20 * 5760.0)) +
                 dVar97 * 72.0 * local_2d20 +
                 (dVar90 * local_2d20 * -2880.0 +
                 dVar85 * local_2d20 * 768.0 +
                 local_2d20 * -8.0 +
                 local_2d20 * -1105920.0 * dVar92 + local_2d20 * 26880.0 * dVar96) * dVar95 +
                 (dVar93 * local_2d20 * dVar95) / 2.0);
  }
  dVar88 = dVar18 * local_2cc0 * 6.0 * dVar19 + -dVar217;
  dVar107 = dVar107 * local_2be0;
  dVar261 = (dVar26 * dVar219 * dVar46) / 54.0;
  local_2d38 = -dVar261 - (dVar26 * dVar28 * local_2cd8) / 18.0;
  local_2d30 = local_2d38;
  if ((dVar106 == 0.0) && (!NAN(dVar106))) {
    local_2d30 = 0.0;
  }
  dVar262 = 1.0 / (dVar108 * local_2be0);
  dVar263 = 1.0 / (dVar108 * dVar107);
  dVar264 = (1.0 / dVar109) / local_2be0;
  dVar265 = (1.0 / dVar109) / dVar107;
  dVar266 = (1.0 / dVar109) / (dVar108 * local_2be0);
  dVar108 = (1.0 / dVar109) / (dVar108 * dVar107);
  local_2be0 = (1.0 / (dVar109 * dVar109)) / local_2be0;
  if ((dVar106 != 0.0) || (NAN(dVar106))) {
    local_2d38 = 0.0;
  }
  dVar109 = dVar113 * (1.0 / dVar112);
  dVar112 = 1.0 / (dVar112 * local_2be8);
  dVar267 = local_2be8 * (dVar113 - 1.0);
  if ((dVar105 != 0.0) || (NAN(dVar105))) {
    local_2d40 = (((((((-(1.0 / dVar107) * local_2d30) / 18.0 + (dVar262 * local_2d30) / 240.0) -
                     (dVar263 * local_2d30) / 4480.0) + (dVar264 * local_2d30) / 103680.0) -
                   (dVar265 * local_2d30) / 2838528.0) + (dVar266 * local_2d30) / 89456640.0) -
                 (dVar108 * local_2d30) / 3185049600.0) + (local_2be0 * local_2d30) / 126340300800.0
    ;
  }
  else {
    local_2d40 = local_2d38 * -2.6666666666666665 * dVar111 +
                 -(local_2be8 * 2.6666666666666665 *
                  ((-(dVar110 * local_2d38) * dVar113 +
                   -(dVar267 * 4.0) * local_2d38 + (dVar112 * local_2d38 * dVar113) / 2.0) * 2.0 *
                   local_2be8 + -local_2d38 * dVar109 + local_2d38 * 2.0 * dVar114));
  }
  dVar268 = dVar119 * dVar119 * dVar119 * dVar119;
  dVar268 = 1.0 / (dVar268 * dVar268 * dVar119);
  dVar269 = dVar222 * -0.07407407407407407 +
            ((*in_R9 * dVar35 * -1.6666666666666667 + dVar221 / 3.0) * 1.8171205928321397 * dVar30)
            / 4.0;
  dVar23 = dVar117 * 1.0814814814814815 * local_2cc0 +
           -(dVar67 * 1.0814814814814815 * local_2cc0) * dVar118 +
           -(dVar269 * local_2b70 * 1.0814814814814815) * dVar118 +
           dVar67 * 1.4419753086419753 * dVar269 +
           dVar23 * -0.003175328964080679 +
           -(dVar116 * 1.1111111111111112 * dVar30 * dVar270 * dVar34);
  dVar34 = dVar37 * dVar18;
  dVar120 = dVar120 * dVar40;
  dVar270 = dVar104 * dVar268;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2d48 = 0.0;
  }
  else {
    local_2d48 = -(dVar14 * 0.36927938319101117) *
                 (dVar88 * dVar119 +
                  dVar22 * (-(dVar120 * 0.3111111111111111) * dVar24 +
                           (dVar222 * -0.17051554074074074 +
                           -((dVar221 * -0.031646617777777775 + -dVar69) * 0.5555555555555556 *
                             1.8171205928321397 * dVar30)) * 0.7777777777777778 * dVar79 +
                           (-dVar227 * dVar24) / 5.0) +
                  -(dVar19 * 6.0) * dVar34 * local_2cc0 +
                  -(double)in_RDI[6] *
                  (dVar104 * local_2d40 * dVar119 +
                   dVar88 * local_2bf0 * dVar119 +
                   dVar22 * (-(dVar101 * 0.010531842222222223) * dVar36 * dVar40 * dVar24 +
                            -(dVar101 * 0.07021228148148148) * dVar221 * dVar79 +
                            local_2d28 * 1.8171205928321397 * dVar30 * 0.026329605555555555 *
                            dVar102 + -(dVar247 * 0.1728395061728395) * dVar30 * dVar40 * dVar24 +
                                      local_2bc0 * (dVar221 * -0.11279007555555555 + dVar69) *
                                      0.43209876543209874 * dVar80 +
                                      local_2d10 * dVar72 * 0.43209876543209874 * dVar80 +
                                      local_2cf8 * dVar61 + -((local_2ba8 * dVar227 * dVar24) / 5.0)
                            ) + dVar217 * dVar103 + -(dVar19 * 6.0 * dVar20 * local_2cc0) +
                  (dVar115 * dVar268 * dVar23) / 10.0) + dVar217 * dVar37 +
                 (dVar270 * dVar23) / 10.0) +
                 local_2cb8 * dVar13 * -0.36927938319101117 * dVar71 + -dVar216;
  }
  dVar214 = -dVar9 * dVar214;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_2d50 = 0.0;
  }
  else {
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      local_2d58 = 0.0;
    }
    else {
      local_2d58 = -local_2e98 - dVar214;
    }
    local_2d50 = local_2d58;
  }
  if ((dVar122 != 0.0) || (NAN(dVar122))) {
    local_2d60 = 0.0;
  }
  else {
    local_2d60 = dVar123 * 1.3333333333333333 * local_2d50;
  }
  dVar23 = (local_2c10 * dVar215 * 0.9847450218426964 * dVar138) / 8.0;
  dVar9 = (double)in_RDI[6];
  dVar148 = dVar148 * local_2c40;
  dVar24 = 1.0 / dVar148;
  dVar69 = (dVar26 * dVar219 * dVar144) / 54.0;
  dVar88 = dVar27 * (1.0 / dVar141);
  dVar144 = 1.0 / (local_2c30 * local_2c30);
  dVar142 = 1.0 / (dVar142 * dVar142);
  if ((dVar43 != 0.0) || (NAN(dVar43))) {
    local_2d68 = 0.0;
  }
  else {
    if ((dVar42 != 0.0) || (NAN(dVar42))) {
      local_2d70 = 0.0;
    }
    else {
      local_2d70 = -local_2d70;
    }
    local_2d68 = local_2d70;
  }
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_2d78 = 0.0;
  }
  else {
    local_2d78 = (dVar142 * local_2d68) / 3.0;
  }
  local_2d78 = dVar144 * local_2d78;
  if ((dVar145 != 0.0) || (NAN(dVar145))) {
    local_2d80 = 0.0;
  }
  else {
    local_2d80 = -dVar69 - (dVar25 * dVar88 * local_2d78) / 18.0;
  }
  if ((dVar147 != 0.0) || (NAN(dVar147))) {
    local_2d88 = local_2d80;
  }
  else {
    local_2d88 = 0.0;
  }
  dVar215 = 1.0 / (dVar149 * local_2c40);
  dVar217 = 1.0 / (dVar149 * dVar148);
  dVar221 = (1.0 / dVar150) / local_2c40;
  dVar222 = (1.0 / dVar150) / dVar148;
  dVar269 = (1.0 / dVar150) / (dVar149 * local_2c40);
  dVar149 = (1.0 / dVar150) / (dVar149 * dVar148);
  local_2c40 = (1.0 / (dVar150 * dVar150)) / local_2c40;
  if ((dVar147 != 0.0) || (NAN(dVar147))) {
    local_2d90 = 0.0;
  }
  else {
    local_2d90 = local_2d80;
  }
  dVar150 = dVar154 * (1.0 / dVar153);
  dVar148 = 1.0 / (dVar153 * local_2c48);
  dVar153 = local_2c48 * (dVar154 - 1.0);
  if ((dVar146 != 0.0) || (NAN(dVar146))) {
    local_2d98 = (((((((-dVar24 * local_2d88) / 18.0 + (dVar215 * local_2d88) / 240.0) -
                     (dVar217 * local_2d88) / 4480.0) + (dVar221 * local_2d88) / 103680.0) -
                   (dVar222 * local_2d88) / 2838528.0) + (dVar269 * local_2d88) / 89456640.0) -
                 (dVar149 * local_2d88) / 3185049600.0) + (local_2c40 * local_2d88) / 126340300800.0
    ;
  }
  else {
    local_2d98 = local_2d90 * -2.6666666666666665 * dVar152 +
                 -(local_2c48 * 2.6666666666666665 *
                  ((-(dVar151 * local_2d90) * dVar154 +
                   -(dVar153 * 4.0) * local_2d90 + (dVar148 * local_2d90 * dVar154) / 2.0) * 2.0 *
                   local_2c48 + -local_2d90 * dVar150 + local_2d90 * 2.0 * dVar155));
  }
  dVar271 = dVar161 * local_2c58;
  dVar272 = dVar162 * dVar271;
  dVar273 = (1.0 / dVar165) / dVar272;
  if ((dVar159 != 0.0) || (NAN(dVar159))) {
    local_2da0 = local_2d80;
  }
  else {
    local_2da0 = 0.0;
  }
  dVar160 = dVar160 * local_2c58;
  dVar161 = dVar161 * dVar160;
  dVar274 = dVar162 * dVar161;
  dVar275 = (1.0 / dVar165) / dVar274;
  dVar276 = 1.0 / dVar271;
  dVar277 = 1.0 / dVar161;
  dVar278 = dVar162 * local_2c58;
  dVar279 = 1.0 / dVar278;
  dVar162 = dVar162 * dVar160;
  dVar280 = 1.0 / dVar162;
  dVar281 = 1.0 / dVar272;
  dVar282 = 1.0 / dVar274;
  dVar283 = 1.0 / (dVar164 * local_2c58);
  dVar284 = (1.0 / dVar164) / dVar160;
  dVar285 = (1.0 / dVar164) / dVar271;
  dVar286 = (1.0 / dVar164) / dVar161;
  dVar287 = (1.0 / dVar164) / dVar278;
  dVar288 = (1.0 / dVar164) / dVar162;
  dVar272 = (1.0 / dVar164) / dVar272;
  dVar274 = (1.0 / dVar164) / dVar274;
  local_2c58 = (1.0 / dVar165) / local_2c58;
  dVar160 = (1.0 / dVar165) / dVar160;
  dVar271 = (1.0 / dVar165) / dVar271;
  dVar161 = (1.0 / dVar165) / dVar161;
  dVar278 = (1.0 / dVar165) / dVar278;
  dVar162 = (1.0 / dVar165) / dVar162;
  dVar170 = local_2c60 * dVar170;
  if ((dVar159 != 0.0) || (NAN(dVar159))) {
    local_2da8 = 0.0;
  }
  else {
    local_2da8 = local_2d80;
  }
  dVar164 = dVar169 * local_2c60;
  dVar165 = dVar164 * 256.0 * local_2da8;
  dVar171 = dVar171 * (1.0 / dVar164);
  dVar289 = (1.0 / local_2c60) * dVar172;
  if ((dVar158 != 0.0) || (NAN(dVar158))) {
    local_2db0 = ((((((-(dVar279 * 3.0438311688311688e-05) * local_2da0 +
                       -(dVar276 * 0.005357142857142857) * local_2da0 +
                       (-dVar273 * local_2da0) / 7.71114500014776e+35 +
                       (dVar275 * local_2da0) / 7.633819549822504e+37 +
                       (dVar277 * local_2da0) / 1920.0 + (dVar280 * local_2da0) / 745472.0) -
                     (dVar281 * local_2da0) / 20643840.0) + (dVar282 * local_2da0) / 668467200.0) -
                   (dVar283 * local_2da0) / 24654643200.0) +
                  (dVar284 * local_2da0) / 1017328435200.0) -
                 (dVar285 * local_2da0) / 46351421276160.0) +
                 ((((((((((dVar286 * local_2da0) / 2.308410703872e+15 -
                         (dVar287 * local_2da0) / 1.24654178009088e+17) +
                        (dVar288 * local_2da0) / 7.250540450807808e+18) -
                       (dVar272 * local_2da0) / 4.517479587281633e+20) +
                      (dVar274 * local_2da0) / 3.000772247138819e+22) -
                     (local_2c58 * local_2da0) / 2.116453759156243e+24) +
                    (dVar160 * local_2da0) / 1.5793369227989443e+26) -
                   (dVar271 * local_2da0) / 1.2429808430244664e+28) +
                  (dVar161 * local_2da0) / 1.0288727798616555e+30) -
                 (dVar278 * local_2da0) / 8.934630842486435e+31) +
                 (dVar162 * local_2da0) / 8.121312287389663e+33;
  }
  else {
    local_2db0 = dVar170 * 48.0 * local_2da8 +
                 (-(dVar289 * 10.0) * local_2da8 +
                 local_2da8 * 10.0 * dVar54 * dVar173 +
                 local_2c60 * local_2da8 * -72.0 +
                 (local_2c60 * local_2da8 * 40.0 + -dVar165) * dVar172 +
                 (dVar171 * local_2da8 * dVar172) / 2.0 + dVar165) * 24.0 * dVar169;
  }
  dVar290 = dVar178 * local_2c70;
  dVar165 = 1.0 / dVar290;
  if ((dVar176 != 0.0) || (NAN(dVar176))) {
    local_2db8 = local_2d80;
  }
  else {
    local_2db8 = 0.0;
  }
  dVar177 = dVar177 * local_2c70;
  dVar178 = dVar178 * dVar177;
  dVar291 = 1.0 / dVar178;
  dVar292 = 1.0 / (dVar180 * local_2c70);
  dVar293 = 1.0 / (dVar180 * dVar177);
  dVar294 = 1.0 / (dVar180 * dVar290);
  dVar295 = 1.0 / (dVar180 * dVar178);
  dVar296 = (1.0 / dVar181) / local_2c70;
  dVar297 = (1.0 / dVar181) / dVar177;
  dVar298 = (1.0 / dVar181) / dVar290;
  dVar299 = (1.0 / dVar181) / dVar178;
  dVar300 = (1.0 / dVar181) / (dVar180 * local_2c70);
  dVar301 = (1.0 / dVar181) / (dVar180 * dVar177);
  dVar302 = (1.0 / dVar181) / (dVar180 * dVar290);
  dVar180 = (1.0 / dVar181) / (dVar180 * dVar178);
  local_2c70 = (1.0 / dVar182) / local_2c70;
  dVar177 = (1.0 / dVar182) / dVar177;
  dVar290 = (1.0 / dVar182) / dVar290;
  dVar178 = (1.0 / dVar182) / dVar178;
  local_2dc8 = ((((((((((((((-(dVar292 * 4.6972703222703225e-06) * local_2db8 +
                             dVar165 * -0.001530612244897959 * local_2db8 +
                             (dVar291 * local_2db8) / 9408.0 + (dVar293 * local_2db8) / 6150144.0) -
                           (dVar294 * local_2db8) / 210862080.0) +
                          (dVar295 * local_2db8) / 8272281600.0) -
                         (dVar296 * local_2db8) / 363245076480.0) +
                        (dVar297 * local_2db8) / 17589608644608.0) -
                       (dVar298 * local_2db8) / 929135308308480.0) +
                      (dVar299 * local_2db8) / 5.3093446189056e+16) -
                     (dVar300 * local_2db8) / 3.26018619408384e+18) +
                    (dVar301 * local_2db8) / 2.1394273287347896e+20) -
                   (dVar302 * local_2db8) / 1.493478751555308e+22) +
                  (dVar180 * local_2db8) / 1.1046592834779778e+24) -
                 (local_2c70 * local_2db8) / 8.627661500560449e+25) +
                (dVar177 * local_2db8) / 7.093855011571925e+27) -
               (dVar290 * local_2db8) / 6.123970353448437e+29) +
               (dVar178 * local_2db8) / 5.53739330121543e+31;
  if ((dVar176 != 0.0) || (NAN(dVar176))) {
    local_2dc0 = 0.0;
  }
  else {
    local_2dc0 = local_2d80;
  }
  dVar187 = dVar187 * (1.0 / dVar183);
  dVar191 = dVar179 * dVar191;
  dVar181 = dVar54 * local_2c78;
  dVar192 = dVar192 * dVar189;
  if ((dVar175 == 0.0) && (!NAN(dVar175))) {
    local_2dc8 = local_2dc0 * 1.1428571428571428 * dVar194 +
                 local_2c78 * 1.1428571428571428 *
                 (-(dVar192 * 2.0) * dVar188 * local_2dc0 +
                 dVar181 * 240.0 * local_2dc0 * dVar193 +
                 dVar183 * 24.0 *
                 (dVar185 * local_2dc0 * 30720.0 +
                 local_2c78 * local_2dc0 * 448.0 + -(dVar183 * local_2dc0 * 5760.0)) +
                 dVar191 * 72.0 * local_2dc0 +
                 (dVar184 * local_2dc0 * -2880.0 +
                 dVar179 * local_2dc0 * 768.0 +
                 local_2dc0 * -8.0 +
                 local_2dc0 * -1105920.0 * dVar186 + local_2dc0 * 26880.0 * dVar190) * dVar189 +
                 (dVar187 * local_2dc0 * dVar189) / 2.0);
  }
  dVar201 = dVar201 * local_2c88;
  dVar182 = (dVar26 * dVar219 * dVar143) / 54.0;
  local_2dd8 = -dVar182 - (dVar26 * dVar28 * local_2d78) / 18.0;
  local_2dd0 = local_2dd8;
  if ((dVar200 == 0.0) && (!NAN(dVar200))) {
    local_2dd0 = 0.0;
  }
  dVar219 = 1.0 / (dVar202 * local_2c88);
  dVar303 = 1.0 / (dVar202 * dVar201);
  dVar304 = (1.0 / dVar203) / local_2c88;
  dVar305 = (1.0 / dVar203) / dVar201;
  dVar306 = (1.0 / dVar203) / (dVar202 * local_2c88);
  dVar202 = (1.0 / dVar203) / (dVar202 * dVar201);
  local_2c88 = (1.0 / (dVar203 * dVar203)) / local_2c88;
  if ((dVar200 != 0.0) || (NAN(dVar200))) {
    local_2dd8 = 0.0;
  }
  dVar203 = dVar207 * (1.0 / dVar206);
  dVar206 = 1.0 / (dVar206 * local_2c90);
  dVar307 = local_2c90 * (dVar207 - 1.0);
  if ((dVar199 != 0.0) || (NAN(dVar199))) {
    local_2de0 = (((((((-(1.0 / dVar201) * local_2dd0) / 18.0 + (dVar219 * local_2dd0) / 240.0) -
                     (dVar303 * local_2dd0) / 4480.0) + (dVar304 * local_2dd0) / 103680.0) -
                   (dVar305 * local_2dd0) / 2838528.0) + (dVar306 * local_2dd0) / 89456640.0) -
                 (dVar202 * local_2dd0) / 3185049600.0) + (local_2c88 * local_2dd0) / 126340300800.0
    ;
  }
  else {
    local_2de0 = local_2dd8 * -2.6666666666666665 * dVar205 +
                 -(local_2c90 * 2.6666666666666665 *
                  ((-(dVar204 * local_2dd8) * dVar207 +
                   -(dVar307 * 4.0) * local_2dd8 + (dVar206 * local_2dd8 * dVar207) / 2.0) * 2.0 *
                   local_2c90 + -local_2dd8 * dVar203 + local_2dd8 * 2.0 * dVar208));
  }
  if ((dVar121 != 0.0) || (NAN(dVar121))) {
    local_2de8 = 0.0;
  }
  else {
    local_2de8 = local_2c10 * 0.9847450218426964 * 0.375 *
                 dVar13 * dVar9 *
                 ((local_2dc8 * 1.8171205928321397 * dVar30 * 0.026329605555555555 * dVar196 +
                  local_2d98 * dVar157 + local_2db0 * dVar29 * 0.43209876543209874 * dVar174) *
                  dVar132 + dVar198 * local_2de0 * dVar213) +
                 local_2d60 * dVar13 * -0.36927938319101117 * dVar138 + -dVar23;
  }
  if ((in_stack_00000008[1] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 0x5c);
    *(double *)(in_stack_00000008[1] + lVar5 * 8) =
         __x * (local_2d48 + local_2de8) + local_2bf8 + local_2ca0 +
         *(double *)(in_stack_00000008[1] + lVar5 * 8);
  }
  local_2eb8 = -local_2e98 - local_2eb8;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    local_2df0 = 0.0;
  }
  else {
    if ((dVar8 != 0.0) || (local_2df8 = local_2eb8, NAN(dVar8))) {
      local_2df8 = 0.0;
    }
    local_2df0 = local_2df8;
  }
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_2e00 = 0.0;
  }
  else {
    local_2e00 = dVar12 * 1.3333333333333333 * local_2df0;
  }
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2e08 = 0.0;
  }
  else {
    if ((dVar43 != 0.0) || (local_2e10 = local_2eb8, NAN(dVar43))) {
      local_2e10 = 0.0;
    }
    local_2e08 = local_2e10;
  }
  if ((dVar44 != 0.0) || (NAN(dVar44))) {
    local_2e18 = 0.0;
  }
  else {
    local_2e18 = (dVar33 * local_2e08) / 3.0;
  }
  dVar41 = dVar41 * local_2e18;
  if ((dVar48 != 0.0) || (NAN(dVar48))) {
    local_2e20 = 0.0;
  }
  else {
    local_2e20 = -dVar47 - (dVar25 * dVar32 * dVar41) / 18.0;
  }
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    local_2e28 = local_2e20;
  }
  else {
    local_2e28 = 0.0;
  }
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    local_2e30 = 0.0;
  }
  else {
    local_2e30 = local_2e20;
  }
  if ((dVar49 != 0.0) || (NAN(dVar49))) {
    local_2e38 = (((((((-dVar218 * local_2e28) / 18.0 + (dVar45 * local_2e28) / 240.0) -
                     (dVar223 * local_2e28) / 4480.0) + (dVar224 * local_2e28) / 103680.0) -
                   (dVar225 * local_2e28) / 2838528.0) + (dVar226 * local_2e28) / 89456640.0) -
                 (dVar52 * local_2e28) / 3185049600.0) + (local_2b98 * local_2e28) / 126340300800.0;
  }
  else {
    local_2e38 = local_2ba0 * -2.6666666666666665 *
                 (-local_2e30 * dVar53 +
                 local_2ba0 * 2.0 *
                 (-(dVar55 * local_2e30) * dVar58 +
                 -(dVar57 * 4.0) * local_2e30 + (dVar51 * local_2e30 * dVar58) / 2.0) +
                 dVar59 * 2.0 * local_2e30) + -(local_2e30 * 2.6666666666666665 * dVar56);
  }
  if ((dVar63 != 0.0) || (NAN(dVar63))) {
    local_2e40 = local_2e20;
  }
  else {
    local_2e40 = 0.0;
  }
  if ((dVar63 != 0.0) || (NAN(dVar63))) {
    local_2e48 = 0.0;
  }
  else {
    local_2e48 = local_2e20;
  }
  dVar11 = dVar68 * 256.0 * local_2e48;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_2e50 = ((((((dVar236 * local_2e40 * -3.0438311688311688e-05 +
                       -(dVar233 * 0.005357142857142857) * local_2e40 +
                       -(dVar230 * local_2e40) / 7.71114500014776e+35 +
                       (dVar232 * local_2e40) / 7.633819549822504e+37 +
                       (dVar234 * local_2e40) / 1920.0 + (dVar237 * local_2e40) / 745472.0) -
                     (dVar238 * local_2e40) / 20643840.0) + (dVar239 * local_2e40) / 668467200.0) -
                   (dVar240 * local_2e40) / 24654643200.0) +
                  (dVar241 * local_2e40) / 1017328435200.0) -
                 (dVar242 * local_2e40) / 46351421276160.0) +
                 ((((((((((dVar243 * local_2e40) / 2.308410703872e+15 -
                         (dVar244 * local_2e40) / 1.24654178009088e+17) +
                        (dVar245 * local_2e40) / 7.250540450807808e+18) -
                       (dVar229 * local_2e40) / 4.517479587281633e+20) +
                      (dVar231 * local_2e40) / 3.000772247138819e+22) -
                     (local_2bb0 * local_2e40) / 2.116453759156243e+24) +
                    (dVar64 * local_2e40) / 1.5793369227989443e+26) -
                   (dVar228 * local_2e40) / 1.2429808430244664e+28) +
                  (dVar65 * local_2e40) / 1.0288727798616555e+30) -
                 (dVar235 * local_2e40) / 8.934630842486435e+31) +
                 (dVar66 * local_2e40) / 8.121312287389663e+33;
  }
  else {
    local_2e50 = dVar74 * 48.0 * local_2e48 +
                 (-(dVar246 * 10.0) * local_2e48 +
                 local_2e48 * 10.0 * dVar54 * dVar77 +
                 local_2bb8 * local_2e48 * -72.0 +
                 (local_2bb8 * local_2e48 * 40.0 + -dVar11) * dVar76 +
                 (dVar75 * local_2e48 * dVar76) / 2.0 + dVar11) * 24.0 * dVar73;
  }
  if ((dVar82 != 0.0) || (NAN(dVar82))) {
    local_2e58 = local_2e20;
  }
  else {
    local_2e58 = 0.0;
  }
  local_2e68 = ((((((((((((((dVar250 * local_2e58 * -4.6972703222703225e-06 +
                             dVar60 * -0.001530612244897959 * local_2e58 +
                             (dVar249 * local_2e58) / 9408.0 + (dVar251 * local_2e58) / 6150144.0) -
                           (dVar252 * local_2e58) / 210862080.0) +
                          (dVar253 * local_2e58) / 8272281600.0) -
                         (dVar254 * local_2e58) / 363245076480.0) +
                        (dVar255 * local_2e58) / 17589608644608.0) -
                       (dVar256 * local_2e58) / 929135308308480.0) +
                      (dVar257 * local_2e58) / 5.3093446189056e+16) -
                     (dVar258 * local_2e58) / 3.26018619408384e+18) +
                    (dVar259 * local_2e58) / 2.1394273287347896e+20) -
                   (dVar260 * local_2e58) / 1.493478751555308e+22) +
                  (dVar86 * local_2e58) / 1.1046592834779778e+24) -
                 (local_2bc8 * local_2e58) / 8.627661500560449e+25) +
                (dVar83 * local_2e58) / 7.093855011571925e+27) -
               (dVar248 * local_2e58) / 6.123970353448437e+29) +
               (dVar84 * local_2e58) / 5.53739330121543e+31;
  if ((dVar82 != 0.0) || (NAN(dVar82))) {
    local_2e60 = 0.0;
  }
  else {
    local_2e60 = local_2e20;
  }
  if ((dVar81 == 0.0) && (!NAN(dVar81))) {
    local_2e68 = local_2e60 * 1.1428571428571428 * dVar100 +
                 local_2bd0 * 1.1428571428571428 *
                 (-(dVar98 * 2.0) * dVar94 * local_2e60 +
                 dVar87 * 240.0 * local_2e60 * dVar99 +
                 dVar89 * 24.0 *
                 (dVar91 * local_2e60 * 30720.0 +
                 local_2bd0 * local_2e60 * 448.0 + -(dVar89 * local_2e60 * 5760.0)) +
                 dVar97 * 72.0 * local_2e60 +
                 (dVar96 * local_2e60 * 26880.0 +
                 dVar90 * local_2e60 * -2880.0 +
                 dVar85 * local_2e60 * 768.0 +
                 local_2e60 * -1105920.0 * dVar92 + -(local_2e60 * 8.0)) * dVar95 +
                 (dVar93 * local_2e60 * dVar95) / 2.0);
  }
  local_2e78 = -dVar261 - (dVar26 * dVar28 * dVar41) / 18.0;
  local_2e70 = local_2e78;
  if ((dVar106 == 0.0) && (!NAN(dVar106))) {
    local_2e70 = 0.0;
  }
  if ((dVar106 != 0.0) || (NAN(dVar106))) {
    local_2e78 = 0.0;
  }
  if ((dVar105 != 0.0) || (NAN(dVar105))) {
    local_2e80 = (((((((-(1.0 / dVar107) * local_2e70) / 18.0 + (dVar262 * local_2e70) / 240.0) -
                     (dVar263 * local_2e70) / 4480.0) + (dVar264 * local_2e70) / 103680.0) -
                   (dVar265 * local_2e70) / 2838528.0) + (dVar266 * local_2e70) / 89456640.0) -
                 (dVar108 * local_2e70) / 3185049600.0) + (local_2be0 * local_2e70) / 126340300800.0
    ;
  }
  else {
    local_2e80 = local_2e78 * -2.6666666666666665 * dVar111 +
                 -(local_2be8 * 2.6666666666666665 *
                  ((-(dVar110 * local_2e78) * dVar113 +
                   -(dVar267 * 4.0) * local_2e78 + (dVar112 * local_2e78 * dVar113) / 2.0) * 2.0 *
                   local_2be8 + -dVar109 * local_2e78 + local_2e78 * 2.0 * dVar114));
  }
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2e88 = 0.0;
  }
  else {
    local_2e88 = local_2b68 * 0.9847450218426964 * 0.375 *
                 dVar13 * dVar9 *
                 ((local_2e68 * 1.8171205928321397 * dVar30 * 0.026329605555555555 * dVar102 +
                  local_2e38 * dVar61 + local_2e50 * dVar72 * 0.43209876543209874 * dVar80) * dVar22
                 + dVar104 * local_2e80 * dVar119) +
                 local_2e00 * dVar13 * -0.36927938319101117 * dVar71 + -dVar216;
  }
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_2e90 = 0.0;
  }
  else {
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      local_2e98 = 0.0;
    }
    else {
      local_2e98 = local_2e98 - dVar214;
    }
    local_2e90 = local_2e98;
  }
  if ((dVar122 != 0.0) || (NAN(dVar122))) {
    local_2ea0 = 0.0;
  }
  else {
    local_2ea0 = dVar123 * 1.3333333333333333 * local_2e90;
  }
  if ((dVar127 != 0.0) || (NAN(dVar127))) {
    local_2ea8 = (-(in_RCX[2] * (1.0 / dVar133)) * dVar126) / 8.0;
  }
  else {
    local_2ea8 = 0.0;
  }
  dVar7 = (local_2c18 * local_2ea8 + local_2c18 * local_2ea8 + dVar128 * local_2ea8 * 9.0) * dVar131
  ;
  dVar129 = dVar129 * ((1.0 / (dVar130 * dVar130)) / dVar130);
  dVar8 = dVar197 * dVar128;
  dVar27 = dVar27 * ((1.0 / dVar141) / dVar140);
  dVar9 = (1.0 / dVar135) / (dVar133 * in_RDX[1]);
  dVar11 = in_RCX[2] * dVar9;
  dVar12 = dVar31 * dVar11;
  dVar32 = dVar38 * dVar2 * dVar3 * ((1.0 / dVar134) / (dVar133 * dVar133 * dVar133));
  dVar33 = dVar12 * -0.40121303703703703 + -(dVar32 * 0.014346394913206906);
  if ((dVar43 != 0.0) || (NAN(dVar43))) {
    local_2eb0 = 0.0;
  }
  else {
    if ((dVar42 != 0.0) || (NAN(dVar42))) {
      local_2eb8 = 0.0;
    }
    else {
      local_2eb8 = -local_2eb8;
    }
    local_2eb0 = local_2eb8;
  }
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    local_2ec0 = 0.0;
  }
  else {
    local_2ec0 = (dVar142 * local_2eb0) / 3.0;
  }
  dVar144 = dVar144 * local_2ec0;
  if ((dVar145 != 0.0) || (NAN(dVar145))) {
    local_2ec8 = 0.0;
  }
  else {
    local_2ec8 = (-dVar69 - (dVar25 * dVar27 * dVar143 * dVar33) / 180.0) -
                 (dVar25 * dVar88 * dVar144) / 18.0;
  }
  if ((dVar147 != 0.0) || (NAN(dVar147))) {
    local_2ed0 = local_2ec8;
  }
  else {
    local_2ed0 = 0.0;
  }
  if ((dVar147 != 0.0) || (NAN(dVar147))) {
    local_2ed8 = 0.0;
  }
  else {
    local_2ed8 = local_2ec8;
  }
  if ((dVar146 != 0.0) || (NAN(dVar146))) {
    local_2ee0 = (((((((-dVar24 * local_2ed0) / 18.0 + (dVar215 * local_2ed0) / 240.0) -
                     (dVar217 * local_2ed0) / 4480.0) + (dVar221 * local_2ed0) / 103680.0) -
                   (dVar222 * local_2ed0) / 2838528.0) + (dVar269 * local_2ed0) / 89456640.0) -
                 (dVar149 * local_2ed0) / 3185049600.0) + (local_2c40 * local_2ed0) / 126340300800.0
    ;
  }
  else {
    local_2ee0 = local_2ed8 * -2.6666666666666665 * dVar152 +
                 -(local_2c48 * 2.6666666666666665 *
                  ((-(dVar151 * local_2ed8) * dVar154 +
                   -(dVar153 * 4.0) * local_2ed8 + (dVar148 * local_2ed8 * dVar154) / 2.0) * 2.0 *
                   local_2c48 + -dVar150 * local_2ed8 + local_2ed8 * 2.0 * dVar155));
  }
  dVar10 = (1.0 / dVar156) / dVar140;
  if ((dVar159 != 0.0) || (NAN(dVar159))) {
    local_2ee8 = local_2ec8;
  }
  else {
    local_2ee8 = 0.0;
  }
  if ((dVar159 != 0.0) || (NAN(dVar159))) {
    local_2ef0 = 0.0;
  }
  else {
    local_2ef0 = local_2ec8;
  }
  dVar41 = dVar164 * 256.0 * local_2ef0;
  if ((dVar158 != 0.0) || (NAN(dVar158))) {
    local_2ef8 = ((((((dVar279 * local_2ee8 * -3.0438311688311688e-05 +
                       -(dVar276 * 0.005357142857142857) * local_2ee8 +
                       -(dVar273 * local_2ee8) / 7.71114500014776e+35 +
                       (dVar275 * local_2ee8) / 7.633819549822504e+37 +
                       (dVar277 * local_2ee8) / 1920.0 + (dVar280 * local_2ee8) / 745472.0) -
                     (dVar281 * local_2ee8) / 20643840.0) + (dVar282 * local_2ee8) / 668467200.0) -
                   (dVar283 * local_2ee8) / 24654643200.0) +
                  (dVar284 * local_2ee8) / 1017328435200.0) -
                 (dVar285 * local_2ee8) / 46351421276160.0) +
                 ((((((((((dVar286 * local_2ee8) / 2.308410703872e+15 -
                         (dVar287 * local_2ee8) / 1.24654178009088e+17) +
                        (dVar288 * local_2ee8) / 7.250540450807808e+18) -
                       (dVar272 * local_2ee8) / 4.517479587281633e+20) +
                      (dVar274 * local_2ee8) / 3.000772247138819e+22) -
                     (local_2c58 * local_2ee8) / 2.116453759156243e+24) +
                    (dVar160 * local_2ee8) / 1.5793369227989443e+26) -
                   (dVar271 * local_2ee8) / 1.2429808430244664e+28) +
                  (dVar161 * local_2ee8) / 1.0288727798616555e+30) -
                 (dVar278 * local_2ee8) / 8.934630842486435e+31) +
                 (dVar162 * local_2ee8) / 8.121312287389663e+33;
  }
  else {
    local_2ef8 = dVar170 * 48.0 * local_2ef0 +
                 (-(dVar289 * 10.0) * local_2ef0 +
                 local_2ef0 * 10.0 * dVar54 * dVar173 +
                 local_2c60 * local_2ef0 * -72.0 +
                 (local_2c60 * local_2ef0 * 40.0 + -dVar41) * dVar172 +
                 (dVar171 * local_2ef0 * dVar172) / 2.0 + dVar41) * 24.0 * dVar169;
  }
  dVar41 = in_R9[1] * dVar136 * 0.24256886666666666;
  dVar42 = local_2c68 * dVar29 * 1.8171205928321397;
  dVar140 = (1.0 / (dVar156 * dVar156)) / dVar140;
  if ((dVar176 != 0.0) || (NAN(dVar176))) {
    local_2f00 = local_2ec8;
  }
  else {
    local_2f00 = 0.0;
  }
  local_2f10 = ((((((((((((((dVar292 * local_2f00 * -4.6972703222703225e-06 +
                             dVar165 * -0.001530612244897959 * local_2f00 +
                             (dVar291 * local_2f00) / 9408.0 + (dVar293 * local_2f00) / 6150144.0) -
                           (dVar294 * local_2f00) / 210862080.0) +
                          (dVar295 * local_2f00) / 8272281600.0) -
                         (dVar296 * local_2f00) / 363245076480.0) +
                        (dVar297 * local_2f00) / 17589608644608.0) -
                       (dVar298 * local_2f00) / 929135308308480.0) +
                      (dVar299 * local_2f00) / 5.3093446189056e+16) -
                     (dVar300 * local_2f00) / 3.26018619408384e+18) +
                    (dVar301 * local_2f00) / 2.1394273287347896e+20) -
                   (dVar302 * local_2f00) / 1.493478751555308e+22) +
                  (dVar180 * local_2f00) / 1.1046592834779778e+24) -
                 (local_2c70 * local_2f00) / 8.627661500560449e+25) +
                (dVar177 * local_2f00) / 7.093855011571925e+27) -
               (dVar290 * local_2f00) / 6.123970353448437e+29) +
               (dVar178 * local_2f00) / 5.53739330121543e+31;
  if ((dVar176 != 0.0) || (NAN(dVar176))) {
    local_2f08 = 0.0;
  }
  else {
    local_2f08 = local_2ec8;
  }
  if ((dVar175 == 0.0) && (!NAN(dVar175))) {
    local_2f10 = local_2f08 * 1.1428571428571428 * dVar194 +
                 local_2c78 * 1.1428571428571428 *
                 (-(dVar192 * 2.0) * dVar188 * local_2f08 +
                 dVar181 * 240.0 * local_2f08 * dVar193 +
                 dVar183 * 24.0 *
                 (dVar185 * local_2f08 * 30720.0 +
                 local_2c78 * local_2f08 * 448.0 + -(dVar183 * local_2f08 * 5760.0)) +
                 dVar191 * 72.0 * local_2f08 +
                 (dVar190 * local_2f08 * 26880.0 +
                 dVar184 * local_2f08 * -2880.0 +
                 dVar179 * local_2f08 * 768.0 +
                 local_2f08 * -1105920.0 * dVar186 + -(local_2f08 * 8.0)) * dVar189 +
                 (dVar187 * local_2f08 * dVar189) / 2.0);
  }
  dVar43 = dVar128 * local_2ea8 * 6.0 * dVar129 + -dVar7;
  local_2f20 = -dVar182 - (dVar26 * dVar28 * dVar144) / 18.0;
  local_2f18 = local_2f20;
  if ((dVar200 == 0.0) && (!NAN(dVar200))) {
    local_2f18 = 0.0;
  }
  if ((dVar200 != 0.0) || (NAN(dVar200))) {
    local_2f20 = 0.0;
  }
  if ((dVar199 != 0.0) || (NAN(dVar199))) {
    local_2f28 = (((((((-(1.0 / dVar201) * local_2f18) / 18.0 + (dVar219 * local_2f18) / 240.0) -
                     (dVar303 * local_2f18) / 4480.0) + (dVar304 * local_2f18) / 103680.0) -
                   (dVar305 * local_2f18) / 2838528.0) + (dVar306 * local_2f18) / 89456640.0) -
                 (dVar202 * local_2f18) / 3185049600.0) + (local_2c88 * local_2f18) / 126340300800.0
    ;
  }
  else {
    local_2f28 = local_2f20 * -2.6666666666666665 * dVar205 +
                 -(local_2c90 * 2.6666666666666665 *
                  ((-(dVar204 * local_2f20) * dVar207 +
                   -(dVar307 * 4.0) * local_2f20 + (dVar206 * local_2f20 * dVar207) / 2.0) * 2.0 *
                   local_2c90 + -dVar203 * local_2f20 + local_2f20 * 2.0 * dVar208));
  }
  dVar26 = dVar213 * dVar213 * dVar213 * dVar213;
  dVar26 = 1.0 / (dVar26 * dVar26 * dVar213);
  dVar28 = dVar12 * -0.07407407407407407 +
           ((in_R9[1] * dVar136 * -1.6666666666666667 + dVar11 / 3.0) * 1.8171205928321397 * dVar30)
           / 4.0;
  dVar9 = dVar211 * 1.0814814814814815 * local_2ea8 +
          -(dVar163 * local_2ea8 * 1.0814814814814815) * dVar212 +
          -(dVar28 * local_2c18 * 1.0814814814814815) * dVar212 +
          dVar163 * 1.4419753086419753 * dVar28 +
          dVar32 * -0.003175328964080679 + -(dVar210 * 1.1111111111111112 * dVar30 * dVar4 * dVar9);
  dVar28 = dVar78 * dVar128;
  dVar167 = dVar167 * dVar140;
  dVar32 = dVar198 * dVar26;
  if ((dVar121 != 0.0) || (NAN(dVar121))) {
    local_2f30 = 0.0;
  }
  else {
    local_2f30 = -(dVar124 * 0.36927938319101117) *
                 (dVar43 * dVar213 +
                  dVar132 * (-(dVar167 * 0.3111111111111111) * dVar33 +
                            (dVar12 * -0.17051554074074074 +
                            -((dVar11 * -0.031646617777777775 + -dVar41) * 0.5555555555555556 *
                              1.8171205928321397 * dVar30)) * 0.7777777777777778 * dVar168 +
                            (-dVar10 * dVar33) / 5.0) +
                  -(dVar129 * 6.0) * dVar28 * local_2ea8 +
                  -(double)in_RDI[6] *
                  (dVar198 * local_2f28 * dVar213 +
                   dVar43 * local_2c98 * dVar213 +
                   dVar132 * (-(dVar195 * 0.010531842222222223) * dVar137 * dVar140 * dVar33 +
                             -(dVar195 * 0.07021228148148148) * dVar11 * dVar168 +
                             local_2f10 * 1.8171205928321397 * dVar30 * 0.026329605555555555 *
                             dVar196 + -(dVar42 * 0.1728395061728395) * dVar30 * dVar140 * dVar33 +
                                       local_2c68 * (dVar11 * -0.11279007555555555 + dVar41) *
                                       0.43209876543209874 * dVar174 +
                                       local_2ef8 * dVar29 * 0.43209876543209874 * dVar174 +
                                       local_2ee0 * dVar157 +
                                       -((local_2c50 * dVar10 * dVar33) / 5.0)) +
                   dVar7 * dVar197 + -(dVar129 * 6.0 * dVar8 * local_2ea8) +
                  (dVar209 * dVar26 * dVar9) / 10.0) + dVar7 * dVar78 + (dVar32 * dVar9) / 10.0) +
                 local_2ea0 * dVar13 * -0.36927938319101117 * dVar138 + -dVar23;
  }
  if ((in_stack_00000008[1] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 0x5c);
    *(double *)(in_stack_00000008[1] + 8 + lVar5 * 8) =
         __x * (local_2e88 + local_2f30) + local_2bf8 + local_2ca0 +
         *(double *)(in_stack_00000008[1] + 8 + lVar5 * 8);
  }
  if ((dVar17 != 0.0) || (NAN(dVar17))) {
    local_2f38 = ((1.0 / dVar308) * dVar16) / 8.0;
  }
  else {
    local_2f38 = 0.0;
  }
  dVar7 = (local_2b70 * local_2f38 + local_2b70 * local_2f38 + dVar18 * local_2f38 * 9.0) * dVar21;
  dVar39 = dVar38 * *in_RCX * dVar39;
  dVar9 = dVar31 * dVar35 * 0.1504548888888889 + dVar39 * 0.00537989809245259;
  if ((dVar48 != 0.0) || (NAN(dVar48))) {
    local_2f40 = 0.0;
  }
  else {
    local_2f40 = (-dVar25 * dVar220 * dVar46 * dVar9) / 180.0;
  }
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    local_2f48 = local_2f40;
  }
  else {
    local_2f48 = 0.0;
  }
  if ((dVar50 != 0.0) || (NAN(dVar50))) {
    local_2f50 = 0.0;
  }
  else {
    local_2f50 = local_2f40;
  }
  if ((dVar49 != 0.0) || (NAN(dVar49))) {
    local_2f58 = (((((((-dVar218 * local_2f48) / 18.0 + (dVar45 * local_2f48) / 240.0) -
                     (dVar223 * local_2f48) / 4480.0) + (dVar224 * local_2f48) / 103680.0) -
                   (dVar225 * local_2f48) / 2838528.0) + (dVar226 * local_2f48) / 89456640.0) -
                 (dVar52 * local_2f48) / 3185049600.0) + (local_2b98 * local_2f48) / 126340300800.0;
  }
  else {
    local_2f58 = local_2ba0 * -2.6666666666666665 *
                 (-local_2f50 * dVar53 +
                 local_2ba0 * 2.0 *
                 (-(dVar55 * local_2f50) * dVar58 +
                 -(dVar57 * 4.0) * local_2f50 + (dVar51 * local_2f50 * dVar58) / 2.0) +
                 dVar59 * 2.0 * local_2f50) + -(local_2f50 * 2.6666666666666665 * dVar56);
  }
  if ((dVar63 != 0.0) || (NAN(dVar63))) {
    local_2f60 = local_2f40;
  }
  else {
    local_2f60 = 0.0;
  }
  if ((dVar63 != 0.0) || (NAN(dVar63))) {
    local_2f68 = 0.0;
  }
  else {
    local_2f68 = local_2f40;
  }
  dVar11 = dVar68 * 256.0 * local_2f68;
  if ((dVar62 != 0.0) || (NAN(dVar62))) {
    local_2f70 = ((((((dVar236 * local_2f60 * -3.0438311688311688e-05 +
                       -(dVar233 * 0.005357142857142857) * local_2f60 +
                       -(dVar230 * local_2f60) / 7.71114500014776e+35 +
                       (dVar232 * local_2f60) / 7.633819549822504e+37 +
                       (dVar234 * local_2f60) / 1920.0 + (dVar237 * local_2f60) / 745472.0) -
                     (dVar238 * local_2f60) / 20643840.0) + (dVar239 * local_2f60) / 668467200.0) -
                   (dVar240 * local_2f60) / 24654643200.0) +
                  (dVar241 * local_2f60) / 1017328435200.0) -
                 (dVar242 * local_2f60) / 46351421276160.0) +
                 ((((((((((dVar243 * local_2f60) / 2.308410703872e+15 -
                         (dVar244 * local_2f60) / 1.24654178009088e+17) +
                        (dVar245 * local_2f60) / 7.250540450807808e+18) -
                       (dVar229 * local_2f60) / 4.517479587281633e+20) +
                      (dVar231 * local_2f60) / 3.000772247138819e+22) -
                     (local_2bb0 * local_2f60) / 2.116453759156243e+24) +
                    (dVar64 * local_2f60) / 1.5793369227989443e+26) -
                   (dVar228 * local_2f60) / 1.2429808430244664e+28) +
                  (dVar65 * local_2f60) / 1.0288727798616555e+30) -
                 (dVar235 * local_2f60) / 8.934630842486435e+31) +
                 (dVar66 * local_2f60) / 8.121312287389663e+33;
  }
  else {
    local_2f70 = dVar74 * 48.0 * local_2f68 +
                 dVar73 * 24.0 *
                 (-(dVar246 * 10.0) * local_2f68 +
                 local_2f68 * 10.0 * dVar54 * dVar77 +
                 local_2bb8 * local_2f68 * -72.0 +
                 (local_2bb8 * local_2f68 * 40.0 + -dVar11) * dVar76 +
                 (dVar75 * local_2f68 * dVar76) / 2.0 + dVar11);
  }
  if ((dVar82 != 0.0) || (NAN(dVar82))) {
    local_2f78 = local_2f40;
  }
  else {
    local_2f78 = 0.0;
  }
  local_2f88 = ((((((((((((((dVar250 * local_2f78 * -4.6972703222703225e-06 +
                             dVar60 * -0.001530612244897959 * local_2f78 +
                             (dVar249 * local_2f78) / 9408.0 + (dVar251 * local_2f78) / 6150144.0) -
                           (dVar252 * local_2f78) / 210862080.0) +
                          (dVar253 * local_2f78) / 8272281600.0) -
                         (dVar254 * local_2f78) / 363245076480.0) +
                        (dVar255 * local_2f78) / 17589608644608.0) -
                       (dVar256 * local_2f78) / 929135308308480.0) +
                      (dVar257 * local_2f78) / 5.3093446189056e+16) -
                     (dVar258 * local_2f78) / 3.26018619408384e+18) +
                    (dVar259 * local_2f78) / 2.1394273287347896e+20) -
                   (dVar260 * local_2f78) / 1.493478751555308e+22) +
                  (dVar86 * local_2f78) / 1.1046592834779778e+24) -
                 (local_2bc8 * local_2f78) / 8.627661500560449e+25) +
                (dVar83 * local_2f78) / 7.093855011571925e+27) -
               (dVar248 * local_2f78) / 6.123970353448437e+29) +
               (dVar84 * local_2f78) / 5.53739330121543e+31;
  if ((dVar82 != 0.0) || (NAN(dVar82))) {
    local_2f80 = 0.0;
  }
  else {
    local_2f80 = local_2f40;
  }
  if ((dVar81 == 0.0) && (!NAN(dVar81))) {
    local_2f88 = local_2f80 * 1.1428571428571428 * dVar100 +
                 local_2bd0 * 1.1428571428571428 *
                 (-(dVar98 * 2.0) * dVar94 * local_2f80 +
                 dVar87 * 240.0 * local_2f80 * dVar99 +
                 dVar89 * 24.0 *
                 (dVar91 * local_2f80 * 30720.0 +
                 local_2bd0 * local_2f80 * 448.0 + -(dVar89 * local_2f80 * 5760.0)) +
                 dVar97 * 72.0 * local_2f80 +
                 (dVar96 * local_2f80 * 26880.0 +
                 dVar90 * local_2f80 * -2880.0 +
                 dVar85 * local_2f80 * 768.0 +
                 local_2f80 * -1105920.0 * dVar92 + -(local_2f80 * 8.0)) * dVar95 +
                 (dVar93 * local_2f80 * dVar95) / 2.0);
  }
  dVar11 = dVar30 * dVar35;
  dVar12 = dVar18 * local_2f38 * 6.0 * dVar19 + -dVar7;
  dVar308 = dVar117 * 1.0814814814814815 * local_2f38 +
            -(dVar67 * local_2f38 * 1.0814814814814815) * dVar118 +
            dVar31 * dVar35 * local_2b70 * dVar118 * 0.003755144032921811 +
            dVar67 * 1.8171205928321397 * dVar11 * -0.005006858710562414 +
            dVar39 * 0.0011907483615302545 + dVar116 * 0.4166666666666667 * dVar11;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2f90 = 0.0;
  }
  else {
    local_2f90 = dVar14 * -0.36927938319101117 *
                 (dVar12 * dVar119 +
                  dVar22 * (-(dVar120 * 0.3111111111111111) * dVar9 +
                           dVar31 * dVar35 * dVar79 * 0.04460577520576132 + (-dVar227 * dVar9) / 5.0
                           ) +
                  -(dVar19 * 6.0) * dVar34 * local_2f38 +
                  -(double)in_RDI[6] *
                  (dVar12 * local_2bf0 * dVar119 +
                   dVar22 * (-(dVar101 * 0.010531842222222223) * dVar36 * dVar40 * dVar9 +
                            local_2bd8 * 1.8171205928321397 * 0.026329605555555555 * dVar11 * dVar79
                            + local_2f88 * 1.8171205928321397 * dVar30 * 0.026329605555555555 *
                              dVar102 + -(dVar247 * 0.1728395061728395) * dVar30 * dVar40 * dVar9 +
                                        local_2bc0 * dVar35 * 0.018276169650205763 * dVar80 +
                                        local_2f70 * dVar72 * 0.43209876543209874 * dVar80 +
                                        local_2f58 * dVar61 +
                                        -((local_2ba8 * dVar227 * dVar9) / 5.0)) +
                   dVar7 * dVar103 + -(dVar19 * 6.0 * dVar20 * local_2f38) +
                  (dVar115 * dVar268 * dVar308) / 10.0) + dVar7 * dVar37 +
                 (dVar270 * dVar308) / 10.0);
  }
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + lVar5 * 8) =
         __x * local_2f90 + *(double *)(in_stack_00000008[2] + lVar5 * 8);
  }
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + 8 + lVar5 * 8) =
         *(double *)(in_stack_00000008[2] + 8 + lVar5 * 8) + 0.0;
  }
  if ((dVar127 != 0.0) || (NAN(dVar127))) {
    local_2f98 = ((1.0 / dVar1) * dVar126) / 8.0;
  }
  else {
    local_2f98 = 0.0;
  }
  dVar7 = (local_2c18 * local_2f98 + local_2c18 * local_2f98 + dVar128 * local_2f98 * 9.0) * dVar131
  ;
  dVar139 = dVar38 * in_RCX[2] * dVar139;
  dVar9 = dVar31 * dVar136 * 0.1504548888888889 + dVar139 * 0.00537989809245259;
  if ((dVar145 != 0.0) || (NAN(dVar145))) {
    local_2fa0 = 0.0;
  }
  else {
    local_2fa0 = (-dVar25 * dVar27 * dVar143 * dVar9) / 180.0;
  }
  if ((dVar147 != 0.0) || (NAN(dVar147))) {
    local_2fa8 = local_2fa0;
  }
  else {
    local_2fa8 = 0.0;
  }
  if ((dVar147 != 0.0) || (NAN(dVar147))) {
    local_2fb0 = 0.0;
  }
  else {
    local_2fb0 = local_2fa0;
  }
  if ((dVar146 != 0.0) || (NAN(dVar146))) {
    local_2fb8 = (((((((-dVar24 * local_2fa8) / 18.0 + (dVar215 * local_2fa8) / 240.0) -
                     (dVar217 * local_2fa8) / 4480.0) + (dVar221 * local_2fa8) / 103680.0) -
                   (dVar222 * local_2fa8) / 2838528.0) + (dVar269 * local_2fa8) / 89456640.0) -
                 (dVar149 * local_2fa8) / 3185049600.0) + (local_2c40 * local_2fa8) / 126340300800.0
    ;
  }
  else {
    local_2fb8 = local_2fb0 * -2.6666666666666665 * dVar152 +
                 -(local_2c48 * 2.6666666666666665 *
                  ((-(dVar151 * local_2fb0) * dVar154 +
                   -(dVar153 * 4.0) * local_2fb0 + (dVar148 * local_2fb0 * dVar154) / 2.0) * 2.0 *
                   local_2c48 + -dVar150 * local_2fb0 + local_2fb0 * 2.0 * dVar155));
  }
  if ((dVar159 != 0.0) || (NAN(dVar159))) {
    local_2fc0 = local_2fa0;
  }
  else {
    local_2fc0 = 0.0;
  }
  if ((dVar159 != 0.0) || (NAN(dVar159))) {
    local_2fc8 = 0.0;
  }
  else {
    local_2fc8 = local_2fa0;
  }
  dVar11 = dVar164 * 256.0 * local_2fc8;
  if ((dVar158 != 0.0) || (NAN(dVar158))) {
    local_2fd0 = ((((((dVar279 * local_2fc0 * -3.0438311688311688e-05 +
                       -(dVar276 * 0.005357142857142857) * local_2fc0 +
                       -(dVar273 * local_2fc0) / 7.71114500014776e+35 +
                       (dVar275 * local_2fc0) / 7.633819549822504e+37 +
                       (dVar277 * local_2fc0) / 1920.0 + (dVar280 * local_2fc0) / 745472.0) -
                     (dVar281 * local_2fc0) / 20643840.0) + (dVar282 * local_2fc0) / 668467200.0) -
                   (dVar283 * local_2fc0) / 24654643200.0) +
                  (dVar284 * local_2fc0) / 1017328435200.0) -
                 (dVar285 * local_2fc0) / 46351421276160.0) +
                 ((((((((((dVar286 * local_2fc0) / 2.308410703872e+15 -
                         (dVar287 * local_2fc0) / 1.24654178009088e+17) +
                        (dVar288 * local_2fc0) / 7.250540450807808e+18) -
                       (dVar272 * local_2fc0) / 4.517479587281633e+20) +
                      (dVar274 * local_2fc0) / 3.000772247138819e+22) -
                     (local_2c58 * local_2fc0) / 2.116453759156243e+24) +
                    (dVar160 * local_2fc0) / 1.5793369227989443e+26) -
                   (dVar271 * local_2fc0) / 1.2429808430244664e+28) +
                  (dVar161 * local_2fc0) / 1.0288727798616555e+30) -
                 (dVar278 * local_2fc0) / 8.934630842486435e+31) +
                 (dVar162 * local_2fc0) / 8.121312287389663e+33;
  }
  else {
    local_2fd0 = dVar170 * 48.0 * local_2fc8 +
                 (-(dVar289 * 10.0) * local_2fc8 +
                 local_2fc8 * 10.0 * dVar54 * dVar173 +
                 local_2c60 * local_2fc8 * -72.0 +
                 (local_2c60 * local_2fc8 * 40.0 + -dVar11) * dVar172 +
                 (dVar171 * local_2fc8 * dVar172) / 2.0 + dVar11) * 24.0 * dVar169;
  }
  if ((dVar176 != 0.0) || (NAN(dVar176))) {
    local_2fd8 = local_2fa0;
  }
  else {
    local_2fd8 = 0.0;
  }
  local_2fe8 = ((((((((((((((dVar292 * local_2fd8 * -4.6972703222703225e-06 +
                             dVar165 * -0.001530612244897959 * local_2fd8 +
                             (dVar291 * local_2fd8) / 9408.0 + (dVar293 * local_2fd8) / 6150144.0) -
                           (dVar294 * local_2fd8) / 210862080.0) +
                          (dVar295 * local_2fd8) / 8272281600.0) -
                         (dVar296 * local_2fd8) / 363245076480.0) +
                        (dVar297 * local_2fd8) / 17589608644608.0) -
                       (dVar298 * local_2fd8) / 929135308308480.0) +
                      (dVar299 * local_2fd8) / 5.3093446189056e+16) -
                     (dVar300 * local_2fd8) / 3.26018619408384e+18) +
                    (dVar301 * local_2fd8) / 2.1394273287347896e+20) -
                   (dVar302 * local_2fd8) / 1.493478751555308e+22) +
                  (dVar180 * local_2fd8) / 1.1046592834779778e+24) -
                 (local_2c70 * local_2fd8) / 8.627661500560449e+25) +
                (dVar177 * local_2fd8) / 7.093855011571925e+27) -
               (dVar290 * local_2fd8) / 6.123970353448437e+29) +
               (dVar178 * local_2fd8) / 5.53739330121543e+31;
  if ((dVar176 != 0.0) || (NAN(dVar176))) {
    local_2fe0 = 0.0;
  }
  else {
    local_2fe0 = local_2fa0;
  }
  if ((dVar175 == 0.0) && (!NAN(dVar175))) {
    local_2fe8 = local_2fe0 * 1.1428571428571428 * dVar194 +
                 local_2c78 * 1.1428571428571428 *
                 (-(dVar192 * 2.0) * dVar188 * local_2fe0 +
                 dVar181 * 240.0 * local_2fe0 * dVar193 +
                 dVar183 * 24.0 *
                 (dVar185 * local_2fe0 * 30720.0 +
                 local_2c78 * local_2fe0 * 448.0 + -(dVar183 * local_2fe0 * 5760.0)) +
                 dVar191 * 72.0 * local_2fe0 +
                 (dVar190 * local_2fe0 * 26880.0 +
                 dVar184 * local_2fe0 * -2880.0 +
                 dVar179 * local_2fe0 * 768.0 +
                 local_2fe0 * -1105920.0 * dVar186 + -(local_2fe0 * 8.0)) * dVar189 +
                 (dVar187 * local_2fe0 * dVar189) / 2.0);
  }
  dVar11 = dVar30 * dVar136;
  dVar12 = dVar129 * 6.0 * dVar128 * local_2f98 + -dVar7;
  dVar308 = dVar211 * 1.0814814814814815 * local_2f98 +
            -(dVar163 * local_2f98 * 1.0814814814814815) * dVar212 +
            dVar31 * dVar136 * local_2c18 * dVar212 * 0.003755144032921811 +
            dVar163 * 1.8171205928321397 * dVar11 * -0.005006858710562414 +
            dVar139 * 0.0011907483615302545 + dVar210 * 0.4166666666666667 * dVar11;
  if ((dVar121 != 0.0) || (NAN(dVar121))) {
    local_2ff0 = 0.0;
  }
  else {
    local_2ff0 = dVar124 * -0.36927938319101117 *
                 (dVar12 * dVar213 +
                  dVar132 * (-(dVar167 * 0.3111111111111111) * dVar9 +
                            dVar31 * dVar136 * dVar168 * 0.04460577520576132 +
                            (-dVar10 * dVar9) / 5.0) +
                  -(dVar129 * 6.0) * dVar28 * local_2f98 +
                  -(double)in_RDI[6] *
                  (dVar12 * local_2c98 * dVar213 +
                   dVar132 * (-(dVar195 * 0.010531842222222223) * dVar137 * dVar140 * dVar9 +
                             local_2c80 * 1.8171205928321397 * 0.026329605555555555 *
                             dVar11 * dVar168 +
                             local_2fe8 * 1.8171205928321397 * dVar30 * 0.026329605555555555 *
                             dVar196 + -(dVar42 * 0.1728395061728395) * dVar30 * dVar140 * dVar9 +
                                       local_2c68 * dVar136 * 0.018276169650205763 * dVar174 +
                                       local_2fd0 * dVar29 * 0.43209876543209874 * dVar174 +
                                       local_2fb8 * dVar157 + -((local_2c50 * dVar10 * dVar9) / 5.0)
                             ) + dVar7 * dVar197 + -(dVar129 * 6.0 * dVar8 * local_2f98) +
                  (dVar209 * dVar26 * dVar308) / 10.0) + dVar7 * dVar78 + (dVar32 * dVar308) / 10.0)
    ;
  }
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + 0x10 + lVar5 * 8) =
         __x * local_2ff0 + *(double *)(in_stack_00000008[2] + 0x10 + lVar5 * 8);
  }
  if (((in_stack_00000008[3] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 100);
    *(double *)(in_stack_00000008[3] + lVar5 * 8) =
         *(double *)(in_stack_00000008[3] + lVar5 * 8) + 0.0;
  }
  if (((in_stack_00000008[3] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 100);
    *(double *)(in_stack_00000008[3] + 8 + lVar5 * 8) =
         *(double *)(in_stack_00000008[3] + 8 + lVar5 * 8) + 0.0;
  }
  if ((dVar17 != 0.0) || (NAN(dVar17))) {
    local_2ff8 = (-dVar15 * (1.0 / (*in_R9 * *in_R9))) / 8.0;
  }
  else {
    local_2ff8 = 0.0;
  }
  dVar21 = (local_2b70 * local_2ff8 + local_2b70 * local_2ff8 + dVar18 * local_2ff8 * 9.0) * dVar21;
  dVar7 = dVar18 * local_2ff8 * 6.0 * dVar19 + -dVar21;
  dVar9 = dVar117 * 1.0814814814814815 * local_2ff8 +
          -(dVar67 * local_2ff8 * 1.0814814814814815) * dVar118 +
          dVar67 * 0.36049382716049383 * dVar70 * dVar31 +
          -(dVar70 * 1.8171205928321397 * 0.27037037037037037 * dVar30 * local_2b70 * dVar118);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_3000 = 0.0;
  }
  else {
    local_3000 = dVar14 * -0.36927938319101117 *
                 (dVar7 * dVar119 +
                  -(dVar22 * dVar70 * 0.06288822469135802) * dVar80 +
                  -(dVar19 * 6.0) * dVar34 * local_2ff8 +
                  -(double)in_RDI[6] *
                  (dVar7 * local_2bf0 * dVar119 +
                   -(dVar22 * local_2bc0 * 0.06288822469135802) *
                   dVar70 * 1.8171205928321397 * dVar30 * dVar79 +
                   dVar21 * dVar103 + -(dVar19 * 6.0 * dVar20 * local_2ff8) +
                  (dVar115 * dVar268 * dVar9) / 10.0) + dVar21 * dVar37 + (dVar270 * dVar9) / 10.0);
  }
  if (((in_stack_00000008[4] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xd];
    *(double *)(in_stack_00000008[4] + lVar5 * 8) =
         __x * local_3000 + *(double *)(in_stack_00000008[4] + lVar5 * 8);
  }
  if ((dVar127 != 0.0) || (NAN(dVar127))) {
    local_3008 = (-dVar125 * (1.0 / (in_R9[1] * in_R9[1]))) / 8.0;
  }
  else {
    local_3008 = 0.0;
  }
  dVar131 = (local_2c18 * local_3008 + local_2c18 * local_3008 + dVar128 * local_3008 * 9.0) *
            dVar131;
  dVar6 = dVar129 * 6.0 * dVar128 * local_3008 + -dVar131;
  dVar7 = dVar211 * 1.0814814814814815 * local_3008 +
          -(dVar163 * local_3008 * 1.0814814814814815) * dVar212 +
          dVar163 * 0.36049382716049383 * dVar166 * dVar31 +
          -(dVar166 * 1.8171205928321397 * 0.27037037037037037 * dVar30 * local_2c18 * dVar212);
  if ((dVar121 != 0.0) || (NAN(dVar121))) {
    local_3010 = 0.0;
  }
  else {
    local_3010 = dVar124 * -0.36927938319101117 *
                 (dVar6 * dVar213 +
                  -(dVar132 * dVar166 * 0.06288822469135802) * dVar174 +
                  -(dVar129 * 6.0) * dVar28 * local_3008 +
                  -(double)in_RDI[6] *
                  (dVar6 * local_2c98 * dVar213 +
                   -(dVar132 * local_2c68 * 0.06288822469135802) *
                   dVar166 * 1.8171205928321397 * dVar30 * dVar168 +
                   dVar131 * dVar197 + -(dVar129 * 6.0 * dVar8 * local_3008) +
                  (dVar209 * dVar26 * dVar7) / 10.0) + dVar131 * dVar78 + (dVar32 * dVar7) / 10.0);
  }
  if (((in_stack_00000008[4] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xd];
    *(double *)(in_stack_00000008[4] + 8 + lVar5 * 8) =
         __x * local_3010 + *(double *)(in_stack_00000008[4] + 8 + lVar5 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_vxc_pol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t1, t2, t3, t4, t5, t6, t7, t10;
  double t11, t14, t15, t16, t18, t19, t20, t21;
  double t22, t23, t25, t26, t28, t30, t31, t32;
  double t33, t34, t35, t37, t38, t39, t40, t44;
  double t48, t49, t50, t52, t53, t54, t55, t57;
  double t59, t60, t62, t63, t64, t65, t69, t73;
  double tzk0;

  double t74, t75, t76, t78, t81, t86, t87, t91;
  double t92, t93, t94, t95, t96, t98, t100, t104;
  double t105, t107, t110, t118, t120, tvrho0, t124, t127;
  double t133, t135, t138, t143, t144, t145, t146, t148;
  double t150, t154, tvrho1, t157, t159, t162, tvsigma0, tvsigma1;
  double t163, t165, t168, tvsigma2;


  t1 = rho[0] <= p->dens_threshold;
  t2 = M_CBRT3;
  t3 = M_CBRTPI;
  t4 = 0.1e1 / t3;
  t5 = t2 * t4;
  t6 = rho[0] + rho[1];
  t7 = 0.1e1 / t6;
  t10 = 0.2e1 * rho[0] * t7 <= p->zeta_threshold;
  t11 = p->zeta_threshold - 0.1e1;
  t14 = 0.2e1 * rho[1] * t7 <= p->zeta_threshold;
  t15 = -t11;
  t16 = rho[0] - rho[1];
  t18 = my_piecewise5(t10, t11, t14, t15, t16 * t7);
  t19 = 0.1e1 + t18;
  t20 = t19 <= p->zeta_threshold;
  t21 = POW_1_3(p->zeta_threshold);
  t22 = t21 * p->zeta_threshold;
  t23 = POW_1_3(t19);
  t25 = my_piecewise3(t20, t22, t23 * t19);
  t26 = POW_1_3(t6);
  t28 = t2 * t2;
  t30 = POW_1_3(0.1e1 / M_PI);
  t31 = 0.1e1 / t30;
  t32 = t28 * t31;
  t33 = M_CBRT4;
  t34 = sqrt(sigma[0]);
  t35 = POW_1_3(rho[0]);
  t37 = 0.1e1 / t35 / rho[0];
  t38 = t34 * t37;
  t39 = sqrt(t38);
  t40 = t39 * t38;
  t44 = 0.1e1 + 0.2e1 / 0.1233e4 * t32 * t33 * t40;
  t48 = my_piecewise3(t1, 0, -0.3e1 / 0.8e1 * t5 * t25 * t26 * t44);
  t49 = rho[1] <= p->dens_threshold;
  t50 = -t16;
  t52 = my_piecewise5(t14, t11, t10, t15, t50 * t7);
  t53 = 0.1e1 + t52;
  t54 = t53 <= p->zeta_threshold;
  t55 = POW_1_3(t53);
  t57 = my_piecewise3(t54, t22, t55 * t53);
  t59 = sqrt(sigma[2]);
  t60 = POW_1_3(rho[1]);
  t62 = 0.1e1 / t60 / rho[1];
  t63 = t59 * t62;
  t64 = sqrt(t63);
  t65 = t64 * t63;
  t69 = 0.1e1 + 0.2e1 / 0.1233e4 * t32 * t33 * t65;
  t73 = my_piecewise3(t49, 0, -0.3e1 / 0.8e1 * t5 * t57 * t26 * t69);
  tzk0 = t48 + t73;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

  t74 = t6 * t6;
  t75 = 0.1e1 / t74;
  t76 = t16 * t75;
  t78 = my_piecewise5(t10, 0, t14, 0, t7 - t76);
  t81 = my_piecewise3(t20, 0, 0.4e1 / 0.3e1 * t23 * t78);
  t86 = t26 * t26;
  t87 = 0.1e1 / t86;
  t91 = t5 * t25 * t87 * t44 / 0.8e1;
  t92 = t4 * t25;
  t93 = t26 * t31;
  t94 = t92 * t93;
  t95 = t33 * t39;
  t96 = rho[0] * rho[0];
  t98 = 0.1e1 / t35 / t96;
  t100 = t95 * t34 * t98;
  t104 = my_piecewise3(t1, 0, -0.3e1 / 0.8e1 * t5 * t81 * t26 * t44 - t91 + t94 * t100 / 0.274e3);
  t105 = t50 * t75;
  t107 = my_piecewise5(t14, 0, t10, 0, -t7 - t105);
  t110 = my_piecewise3(t54, 0, 0.4e1 / 0.3e1 * t55 * t107);
  t118 = t5 * t57 * t87 * t69 / 0.8e1;
  t120 = my_piecewise3(t49, 0, -0.3e1 / 0.8e1 * t5 * t110 * t26 * t69 - t118);
  tvrho0 = t48 + t73 + t6 * (t104 + t120);

  if(out->vrho != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vrho[ip*p->dim.vrho + 0] += tvrho0;

  t124 = my_piecewise5(t10, 0, t14, 0, -t7 - t76);
  t127 = my_piecewise3(t20, 0, 0.4e1 / 0.3e1 * t23 * t124);
  t133 = my_piecewise3(t1, 0, -0.3e1 / 0.8e1 * t5 * t127 * t26 * t44 - t91);
  t135 = my_piecewise5(t14, 0, t10, 0, t7 - t105);
  t138 = my_piecewise3(t54, 0, 0.4e1 / 0.3e1 * t55 * t135);
  t143 = t4 * t57;
  t144 = t143 * t93;
  t145 = t33 * t64;
  t146 = rho[1] * rho[1];
  t148 = 0.1e1 / t60 / t146;
  t150 = t145 * t59 * t148;
  t154 = my_piecewise3(t49, 0, -0.3e1 / 0.8e1 * t5 * t138 * t26 * t69 - t118 + t144 * t150 / 0.274e3);
  tvrho1 = t48 + t73 + t6 * (t133 + t154);

  if(out->vrho != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vrho[ip*p->dim.vrho + 1] += tvrho1;

  t157 = 0.1e1 / t34;
  t159 = t95 * t157 * t37;
  t162 = my_piecewise3(t1, 0, -0.3e1 / 0.2192e4 * t94 * t159);
  tvsigma0 = t6 * t162;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 0] += tvsigma0;

  tvsigma1 = 0.e0;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 1] += tvsigma1;

  t163 = 0.1e1 / t59;
  t165 = t145 * t163 * t62;
  t168 = my_piecewise3(t49, 0, -0.3e1 / 0.2192e4 * t144 * t165);
  tvsigma2 = t6 * t168;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 2] += tvsigma2;

}